

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bvh_intersector_hybrid.cpp
# Opt level: O3

void embree::avx::
     BVHNIntersectorKHybrid<8,_4,_16777232,_true,_embree::avx::ArrayIntersectorK_1<4,_embree::avx::QuadMiMBIntersectorKPluecker<4,_4,_true>_>,_true>
     ::occluded(vint<4> *valid_i,Intersectors *This,RayK<4> *ray,RayQueryContext *context)

{
  RayK<4> *pRVar1;
  uint uVar2;
  uint uVar3;
  BVH *bvh;
  Geometry *pGVar4;
  long lVar5;
  RTCFilterFunctionN p_Var6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [12];
  undefined1 auVar17 [12];
  undefined1 auVar18 [12];
  undefined8 uVar19;
  undefined8 uVar20;
  undefined8 uVar21;
  undefined8 uVar22;
  uint uVar23;
  undefined4 uVar24;
  int iVar25;
  AABBNodeMB4D *node1;
  ulong uVar26;
  ulong uVar27;
  ulong uVar28;
  ulong uVar29;
  long lVar30;
  ulong uVar31;
  QuadMesh *mesh;
  NodeRef root;
  uint uVar32;
  size_t sVar33;
  long lVar34;
  ulong uVar35;
  ulong in_R10;
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 *paVar36;
  NodeRef *pNVar37;
  ulong uVar38;
  bool bVar39;
  float fVar40;
  float fVar41;
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  float fVar49;
  float fVar50;
  undefined1 in_ZMM0 [64];
  float fVar51;
  float fVar52;
  float fVar74;
  float fVar76;
  undefined1 auVar53 [16];
  anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1 aVar54;
  undefined1 auVar55 [16];
  undefined1 auVar56 [16];
  float fVar78;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  undefined1 auVar60 [16];
  undefined1 auVar61 [16];
  undefined1 auVar62 [16];
  float fVar75;
  float fVar77;
  float fVar79;
  undefined1 auVar63 [16];
  undefined1 auVar64 [16];
  undefined1 auVar65 [16];
  undefined1 auVar66 [16];
  undefined1 auVar67 [16];
  undefined1 auVar68 [16];
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  float fVar80;
  anon_union_16_2_9473010e_for_vint_impl<4>_1 aVar71;
  anon_union_16_2_9473010e_for_vboolf_impl<4>_1 aVar72;
  undefined1 auVar73 [16];
  float fVar81;
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar84 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar87 [16];
  float fVar105;
  float fVar107;
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar90 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  float fVar104;
  float fVar106;
  undefined1 auVar103 [64];
  float fVar108;
  float fVar109;
  float fVar131;
  float fVar133;
  vint4 ai_2;
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  float fVar134;
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  float fVar132;
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  float fVar135;
  float fVar136;
  float fVar137;
  float fVar156;
  float fVar159;
  vint4 bi_1;
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  float fVar162;
  undefined1 auVar143 [16];
  float fVar157;
  float fVar160;
  float fVar163;
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  float fVar158;
  float fVar161;
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  vint4 bi_3;
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar173 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  vint4 bi;
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  float fVar191;
  float fVar192;
  float fVar197;
  float fVar198;
  float fVar199;
  vint4 bi_2;
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  float fVar200;
  undefined1 auVar196 [16];
  float fVar201;
  float fVar202;
  float fVar203;
  float fVar210;
  float fVar211;
  float fVar212;
  float fVar213;
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  float fVar214;
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  float fVar215;
  float fVar216;
  float fVar223;
  float fVar224;
  undefined1 auVar217 [16];
  undefined1 auVar218 [16];
  float fVar225;
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  float fVar226;
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  float fVar233;
  float fVar234;
  float fVar235;
  float fVar236;
  float fVar237;
  undefined1 auVar232 [64];
  undefined1 auVar238 [16];
  undefined1 auVar239 [16];
  undefined1 auVar240 [16];
  undefined1 auVar241 [16];
  float fVar242;
  float fVar243;
  float fVar244;
  float fVar245;
  float fVar246;
  float fVar247;
  float fVar248;
  float fVar249;
  vint4 ai;
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  undefined1 in_ZMM13 [64];
  vint4 ai_1;
  undefined1 auVar252 [16];
  undefined1 auVar253 [16];
  vint4 ai_3;
  undefined1 auVar254 [16];
  float fVar256;
  undefined1 auVar255 [16];
  undefined1 in_ZMM15 [64];
  undefined1 local_38a8 [8];
  float fStack_38a0;
  float fStack_389c;
  undefined1 local_3898 [8];
  float fStack_3890;
  float fStack_388c;
  vuint<4> *v;
  Precalculations pre;
  vint<4> itime;
  Vec3<embree::vfloat_impl<4>_> p1;
  float local_3808;
  float fStack_3804;
  float fStack_3800;
  float fStack_37fc;
  float local_37f8;
  float fStack_37f4;
  float fStack_37f0;
  float local_37e8;
  float fStack_37e4;
  float fStack_37e0;
  vbool<4> terminated;
  undefined1 local_37b8 [8];
  float fStack_37b0;
  float fStack_37ac;
  Vec3<embree::vfloat_impl<4>_> p0;
  undefined1 local_36e8 [8];
  float fStack_36e0;
  float fStack_36dc;
  undefined1 local_36d8 [8];
  float fStack_36d0;
  float fStack_36cc;
  undefined1 local_36c8 [8];
  float fStack_36c0;
  float fStack_36bc;
  float local_3698;
  float fStack_3694;
  float fStack_3690;
  TravRayK<4,_true> tray;
  NodeRef stack_node [561];
  vfloat<4> stack_near [561];
  
  uVar22 = mm_lookupmask_ps._248_8_;
  uVar21 = mm_lookupmask_ps._240_8_;
  uVar20 = mm_lookupmask_ps._8_8_;
  uVar19 = mm_lookupmask_ps._0_8_;
  bvh = (BVH *)This->ptr;
  stack_node[1].ptr = (bvh->root).ptr;
  if (stack_node[1].ptr != 8) {
    auVar102 = vpcmpeqd_avx(in_ZMM0._0_16_,in_ZMM0._0_16_);
    auVar82 = vpcmpeqd_avx(auVar102,(undefined1  [16])valid_i->field_0);
    auVar53 = ZEXT816(0) << 0x40;
    auVar7 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar53,5);
    auVar138 = auVar82 & auVar7;
    if ((((auVar138 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
         (auVar138 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar138 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar138[0xf] < '\0'
       ) {
      auVar7 = vandps_avx(auVar7,auVar82);
      tray.org.field_0._0_8_ = *(undefined8 *)ray;
      tray.org.field_0._8_8_ = *(undefined8 *)(ray + 8);
      tray.org.field_0._16_8_ = *(undefined8 *)(ray + 0x10);
      tray.org.field_0._24_8_ = *(undefined8 *)(ray + 0x18);
      tray.org.field_0._32_8_ = *(undefined8 *)(ray + 0x20);
      tray.org.field_0._40_8_ = *(undefined8 *)(ray + 0x28);
      tray.dir.field_0.field_0.x.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x40);
      tray.dir.field_0.field_0.y.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x50);
      tray.dir.field_0.field_0.z.field_0 = (vfloat_impl<4>)*(undefined1 (*) [16])(ray + 0x60);
      auVar204._8_4_ = 0x7fffffff;
      auVar204._0_8_ = 0x7fffffff7fffffff;
      auVar204._12_4_ = 0x7fffffff;
      auVar82 = vandps_avx(auVar204,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar94._8_4_ = 0x219392ef;
      auVar94._0_8_ = 0x219392ef219392ef;
      auVar94._12_4_ = 0x219392ef;
      auVar138 = vcmpps_avx(auVar82,auVar94,1);
      auVar238._8_4_ = 0x3f800000;
      auVar238._0_8_ = 0x3f8000003f800000;
      auVar238._12_4_ = 0x3f800000;
      auVar164 = vdivps_avx(auVar238,(undefined1  [16])tray.dir.field_0.field_0.x.field_0);
      auVar82 = vandps_avx(auVar204,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar118 = vcmpps_avx(auVar82,auVar94,1);
      auVar177 = vdivps_avx(auVar238,(undefined1  [16])tray.dir.field_0.field_0.y.field_0);
      auVar82 = vandps_avx(auVar204,(undefined1  [16])tray.dir.field_0.field_0.z.field_0);
      auVar82 = vcmpps_avx(auVar82,auVar94,1);
      auVar178 = vdivps_avx(auVar238,(undefined1  [16])tray.dir.field_0.field_0.z.field_0);
      auVar119._8_4_ = 0x5d5e0b6b;
      auVar119._0_8_ = 0x5d5e0b6b5d5e0b6b;
      auVar119._12_4_ = 0x5d5e0b6b;
      tray.rdir.field_0.field_0.x.field_0 =
           (vfloat_impl<4>)vblendvps_avx(auVar164,auVar119,auVar138);
      tray.rdir.field_0.field_0.y.field_0 =
           (vfloat_impl<4>)vblendvps_avx(auVar177,auVar119,auVar118);
      tray.rdir.field_0.field_0.z.field_0 = (vfloat_impl<4>)vblendvps_avx(auVar178,auVar119,auVar82)
      ;
      auVar82 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.x.field_0,auVar53,1);
      auVar177._8_4_ = 0x20;
      auVar177._0_8_ = 0x2000000020;
      auVar177._12_4_ = 0x20;
      tray.nearXYZ.field_0.field_0.x.field_0 = (vint_impl<4>)vandps_avx(auVar82,auVar177);
      auVar82 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.y.field_0,auVar53,5);
      auVar138._8_4_ = 0x40;
      auVar138._0_8_ = 0x4000000040;
      auVar138._12_4_ = 0x40;
      auVar178._8_4_ = 0x60;
      auVar178._0_8_ = 0x6000000060;
      auVar178._12_4_ = 0x60;
      tray.nearXYZ.field_0.field_0.y.field_0 =
           (vint_impl<4>)vblendvps_avx(auVar178,auVar138,auVar82);
      auVar82 = vcmpps_avx((undefined1  [16])tray.rdir.field_0.field_0.z.field_0,auVar53,5);
      auVar118._8_4_ = 0x80;
      auVar118._0_8_ = 0x8000000080;
      auVar118._12_4_ = 0x80;
      auVar164._8_4_ = 0xa0;
      auVar164._0_8_ = 0xa0000000a0;
      auVar164._12_4_ = 0xa0;
      tray.nearXYZ.field_0.field_0.z.field_0 =
           (vint_impl<4>)vblendvps_avx(auVar164,auVar118,auVar82);
      auVar82 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar53);
      auVar138 = vmaxps_avx(*(undefined1 (*) [16])(ray + 0x80),auVar53);
      auVar53._8_4_ = 0x7f800000;
      auVar53._0_8_ = 0x7f8000007f800000;
      auVar53._12_4_ = 0x7f800000;
      tray.tnear.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vblendvps_avx(auVar53,auVar82,auVar7);
      auVar82._8_4_ = 0xff800000;
      auVar82._0_8_ = 0xff800000ff800000;
      auVar82._12_4_ = 0xff800000;
      tray.tfar.field_0 =
           (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)vblendvps_avx(auVar82,auVar138,auVar7);
      terminated.field_0.i[1] = auVar7._4_4_ ^ auVar102._4_4_;
      terminated.field_0.i[0] = auVar7._0_4_ ^ auVar102._0_4_;
      terminated.field_0.i[2] = auVar7._8_4_ ^ auVar102._8_4_;
      terminated.field_0.i[3] = auVar7._12_4_ ^ auVar102._12_4_;
      if (context->user == (RTCRayQueryContext *)0x0) {
        uVar32 = 3;
      }
      else {
        uVar32 = ((context->args->flags & RTC_RAY_QUERY_FLAG_COHERENT) ==
                 RTC_RAY_QUERY_FLAG_INCOHERENT) + 2;
      }
      pRVar1 = ray + 0x80;
      pNVar37 = stack_node + 2;
      stack_node[0].ptr = 0xfffffffffffffff8;
      paVar36 = &stack_near[2].field_0;
      stack_near[0].field_0.i[0] = 0x7f800000;
      stack_near[0].field_0.i[1] = 0x7f800000;
      stack_near[0].field_0.i[2] = 0x7f800000;
      stack_near[0].field_0.i[3] = 0x7f800000;
      stack_near[1].field_0 = (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)tray.tnear;
LAB_003d8ca2:
      do {
        do {
          root.ptr = pNVar37[-1].ptr;
          if (root.ptr == 0xfffffffffffffff8) goto LAB_003da611;
          pNVar37 = pNVar37 + -1;
          paVar36 = paVar36 + -1;
          aVar54 = *paVar36;
          auVar102 = vcmpps_avx((undefined1  [16])aVar54,(undefined1  [16])tray.tfar.field_0,1);
          uVar23 = vmovmskps_avx(auVar102);
        } while (uVar23 == 0);
        uVar26 = (ulong)(uVar23 & 0xff);
        uVar23 = POPCOUNT(uVar23 & 0xff);
        if (uVar32 < uVar23) {
LAB_003d8ce7:
          auVar103 = ZEXT1664((undefined1  [16])aVar54);
          do {
            uVar23 = (uint)root.ptr;
            auVar102 = auVar103._0_16_;
            if ((root.ptr & 8) != 0) {
              if (root.ptr == 0xfffffffffffffff8) goto LAB_003da611;
              auVar82 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,auVar102,6);
              if ((((auVar82 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                   (auVar82 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar82 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  auVar82[0xf] < '\0') {
                uVar26 = (ulong)(uVar23 & 0xf);
                if (uVar26 == 8) {
                  auVar102 = vpcmpeqd_avx(auVar102,auVar102);
                  aVar72 = terminated.field_0;
                }
                else {
                  auVar217._0_8_ = terminated.field_0._0_8_ ^ 0xffffffffffffffff;
                  auVar217._8_4_ = terminated.field_0._8_4_ ^ 0xffffffff;
                  auVar217._12_4_ = terminated.field_0._12_4_ ^ 0xffffffff;
                  uVar27 = 0;
                  do {
                    lVar30 = uVar27 * 0x60 + (root.ptr & 0xfffffffffffffff0);
                    uVar24 = vmovmskps_avx(auVar217);
                    in_R10 = CONCAT44((int)(in_R10 >> 0x20),uVar24);
                    auVar232 = ZEXT1664(auVar217);
                    uVar38 = 0;
                    while( true ) {
                      auVar102 = auVar232._0_16_;
                      auVar251 = in_ZMM13._0_16_;
                      uVar23 = *(uint *)(lVar30 + 0x50 + uVar38 * 4);
                      if (uVar23 == 0xffffffff) break;
                      uVar3 = *(uint *)(lVar30 + 0x40 + uVar38 * 4);
                      pGVar4 = (context->scene->geometries).items[uVar3].ptr;
                      fVar40 = (pGVar4->time_range).lower;
                      auVar42._4_4_ = fVar40;
                      auVar42._0_4_ = fVar40;
                      auVar42._8_4_ = fVar40;
                      auVar42._12_4_ = fVar40;
                      fVar49 = pGVar4->fnumTimeSegments;
                      auVar8 = vsubps_avx(*(undefined1 (*) [16])(ray + 0x70),auVar42);
                      auVar82 = ZEXT416((uint)((pGVar4->time_range).upper - fVar40));
                      auVar82 = vshufps_avx(auVar82,auVar82,0);
                      auVar82 = vdivps_avx(auVar8,auVar82);
                      auVar43._0_4_ = fVar49 * auVar82._0_4_;
                      auVar43._4_4_ = fVar49 * auVar82._4_4_;
                      auVar43._8_4_ = fVar49 * auVar82._8_4_;
                      auVar43._12_4_ = fVar49 * auVar82._12_4_;
                      auVar82 = vroundps_avx(auVar43,1);
                      auVar138 = vshufps_avx(ZEXT416((uint)(fVar49 + -1.0)),
                                             ZEXT416((uint)(fVar49 + -1.0)),0);
                      auVar82 = vminps_avx(auVar82,auVar138);
                      auVar82 = vmaxps_avx(auVar82,_DAT_01f7aa10);
                      auVar138 = vsubps_avx(auVar43,auVar82);
                      itime.field_0 =
                           (anon_union_16_2_9473010e_for_vint_impl<4>_1)vcvtps2dq_avx(auVar82);
                      uVar31 = 0;
                      if (in_R10 != 0) {
                        for (; (in_R10 >> uVar31 & 1) == 0; uVar31 = uVar31 + 1) {
                        }
                      }
                      auVar53 = vpshufd_avx(ZEXT416((uint)itime.field_0.i[uVar31]),0);
                      auVar82 = vpcmpeqd_avx(auVar53,(undefined1  [16])itime.field_0);
                      auVar82 = auVar217 & ~auVar82;
                      fVar49 = auVar138._4_4_;
                      fVar81 = auVar138._8_4_;
                      fVar104 = auVar138._12_4_;
                      fVar40 = auVar138._0_4_;
                      if ((((auVar82 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                           (auVar82 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar82 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          -1 < auVar82[0xf]) {
                        lVar34 = (long)itime.field_0.i[uVar31] * 0x38;
                        lVar5 = *(long *)(*(long *)&pGVar4[2].numPrimitives + lVar34);
                        lVar34 = *(long *)(*(long *)&pGVar4[2].numPrimitives + 0x38 + lVar34);
                        uVar31 = (ulong)*(uint *)(lVar30 + uVar38 * 4);
                        uVar29 = (ulong)*(uint *)(lVar30 + 0x10 + uVar38 * 4);
                        fVar105 = *(float *)(lVar5 + uVar31 * 4);
                        fVar106 = *(float *)(lVar5 + 4 + uVar31 * 4);
                        fVar107 = *(float *)(lVar5 + 8 + uVar31 * 4);
                        fVar80 = *(float *)(lVar34 + uVar31 * 4);
                        fVar41 = *(float *)(lVar34 + 4 + uVar31 * 4);
                        fVar109 = *(float *)(lVar34 + 8 + uVar31 * 4);
                        auVar55._8_4_ = 0x3f800000;
                        auVar55._0_8_ = 0x3f8000003f800000;
                        auVar55._12_4_ = 0x3f800000;
                        auVar82 = vsubps_avx(auVar55,auVar138);
                        fVar50 = auVar82._0_4_;
                        fVar132 = auVar82._4_4_;
                        fVar52 = auVar82._8_4_;
                        fVar75 = auVar82._12_4_;
                        auVar130._0_4_ = fVar50 * fVar105 + fVar40 * fVar80;
                        auVar130._4_4_ = fVar132 * fVar105 + fVar49 * fVar80;
                        auVar130._8_4_ = fVar52 * fVar105 + fVar81 * fVar80;
                        auVar130._12_4_ = fVar75 * fVar105 + fVar104 * fVar80;
                        auVar253._0_4_ = fVar50 * fVar106 + fVar40 * fVar41;
                        auVar253._4_4_ = fVar132 * fVar106 + fVar49 * fVar41;
                        auVar253._8_4_ = fVar52 * fVar106 + fVar81 * fVar41;
                        auVar253._12_4_ = fVar75 * fVar106 + fVar104 * fVar41;
                        auVar142._0_4_ = fVar50 * fVar107 + fVar40 * fVar109;
                        auVar142._4_4_ = fVar132 * fVar107 + fVar49 * fVar109;
                        auVar142._8_4_ = fVar52 * fVar107 + fVar81 * fVar109;
                        auVar142._12_4_ = fVar75 * fVar107 + fVar104 * fVar109;
                        fVar105 = *(float *)(lVar5 + uVar29 * 4);
                        fVar106 = *(float *)(lVar5 + 4 + uVar29 * 4);
                        fVar107 = *(float *)(lVar5 + 8 + uVar29 * 4);
                        fVar80 = *(float *)(lVar34 + uVar29 * 4);
                        fVar41 = *(float *)(lVar34 + 4 + uVar29 * 4);
                        fVar109 = *(float *)(lVar34 + 8 + uVar29 * 4);
                        local_3808 = fVar80 * fVar40 + fVar50 * fVar105;
                        fStack_3804 = fVar80 * fVar49 + fVar132 * fVar105;
                        fStack_3800 = fVar80 * fVar81 + fVar52 * fVar105;
                        fStack_37fc = fVar80 * fVar104 + fVar75 * fVar105;
                        local_38a8._4_4_ = fVar41 * fVar49 + fVar132 * fVar106;
                        local_38a8._0_4_ = fVar41 * fVar40 + fVar50 * fVar106;
                        fStack_38a0 = fVar41 * fVar81 + fVar52 * fVar106;
                        fStack_389c = fVar41 * fVar104 + fVar75 * fVar106;
                        local_3898._4_4_ = fVar109 * fVar49 + fVar132 * fVar107;
                        local_3898._0_4_ = fVar109 * fVar40 + fVar50 * fVar107;
                        fStack_3890 = fVar109 * fVar81 + fVar52 * fVar107;
                        fStack_388c = fVar109 * fVar104 + fVar75 * fVar107;
                        uVar31 = (ulong)*(uint *)(lVar30 + 0x20 + uVar38 * 4);
                        fVar105 = *(float *)(lVar5 + uVar31 * 4);
                        fVar106 = *(float *)(lVar5 + 4 + uVar31 * 4);
                        fVar107 = *(float *)(lVar5 + 8 + uVar31 * 4);
                        fVar80 = *(float *)(lVar34 + uVar31 * 4);
                        fVar41 = *(float *)(lVar34 + 4 + uVar31 * 4);
                        fVar109 = *(float *)(lVar34 + 8 + uVar31 * 4);
                        local_36c8._4_4_ = fVar80 * fVar49 + fVar132 * fVar105;
                        local_36c8._0_4_ = fVar80 * fVar40 + fVar50 * fVar105;
                        fStack_36c0 = fVar80 * fVar81 + fVar52 * fVar105;
                        fStack_36bc = fVar80 * fVar104 + fVar75 * fVar105;
                        local_36d8._4_4_ = fVar41 * fVar49 + fVar132 * fVar106;
                        local_36d8._0_4_ = fVar41 * fVar40 + fVar50 * fVar106;
                        fStack_36d0 = fVar41 * fVar81 + fVar52 * fVar106;
                        fStack_36cc = fVar41 * fVar104 + fVar75 * fVar106;
                        local_36e8._4_4_ = fVar109 * fVar49 + fVar132 * fVar107;
                        local_36e8._0_4_ = fVar109 * fVar40 + fVar50 * fVar107;
                        fStack_36e0 = fVar109 * fVar81 + fVar52 * fVar107;
                        fStack_36dc = fVar109 * fVar104 + fVar75 * fVar107;
                        uVar31 = (ulong)*(uint *)(lVar30 + 0x30 + uVar38 * 4);
                        fVar105 = *(float *)(lVar34 + uVar31 * 4);
                        fVar106 = *(float *)(lVar34 + 4 + uVar31 * 4);
                        fVar107 = *(float *)(lVar34 + 8 + uVar31 * 4);
                        fVar80 = *(float *)(lVar5 + uVar31 * 4);
                        auVar206._0_4_ = fVar50 * fVar80 + fVar40 * fVar105;
                        auVar206._4_4_ = fVar132 * fVar80 + fVar49 * fVar105;
                        auVar206._8_4_ = fVar52 * fVar80 + fVar81 * fVar105;
                        auVar206._12_4_ = fVar75 * fVar80 + fVar104 * fVar105;
                        fVar105 = *(float *)(lVar5 + 4 + uVar31 * 4);
                        auVar182._0_4_ = fVar50 * fVar105 + fVar40 * fVar106;
                        auVar182._4_4_ = fVar132 * fVar105 + fVar49 * fVar106;
                        auVar182._8_4_ = fVar52 * fVar105 + fVar81 * fVar106;
                        auVar182._12_4_ = fVar75 * fVar105 + fVar104 * fVar106;
                        fVar105 = *(float *)(lVar5 + 8 + uVar31 * 4);
                        auVar56._0_4_ = fVar50 * fVar105 + fVar40 * fVar107;
                        auVar56._4_4_ = fVar132 * fVar105 + fVar49 * fVar107;
                        auVar56._8_4_ = fVar52 * fVar105 + fVar81 * fVar107;
                        auVar56._12_4_ = fVar75 * fVar105 + fVar104 * fVar107;
                      }
                      else {
                        if (in_R10 != 0) {
                          lVar5 = *(long *)&pGVar4[2].numPrimitives;
                          uVar35 = (ulong)*(uint *)(lVar30 + uVar38 * 4);
                          uVar28 = in_R10;
                          uVar29 = uVar31;
                          do {
                            lVar34 = (long)itime.field_0.i[uVar29] * 0x38;
                            auVar82 = *(undefined1 (*) [16])(*(long *)(lVar5 + lVar34) + uVar35 * 4)
                            ;
                            auVar53 = *(undefined1 (*) [16])
                                       (*(long *)(lVar5 + 0x38 + lVar34) + uVar35 * 4);
                            *(int *)((long)&p0.field_0 + uVar29 * 4) = auVar82._0_4_;
                            uVar24 = vextractps_avx(auVar82,1);
                            *(undefined4 *)((long)&p0.field_0 + uVar29 * 4 + 0x10) = uVar24;
                            uVar24 = vextractps_avx(auVar82,2);
                            *(undefined4 *)((long)&p0.field_0 + uVar29 * 4 + 0x20) = uVar24;
                            *(int *)((long)&p1.field_0 + uVar29 * 4) = auVar53._0_4_;
                            uVar24 = vextractps_avx(auVar53,1);
                            *(undefined4 *)((long)&p1.field_0 + uVar29 * 4 + 0x10) = uVar24;
                            uVar24 = vextractps_avx(auVar53,2);
                            *(undefined4 *)((long)&p1.field_0 + uVar29 * 4 + 0x20) = uVar24;
                            uVar28 = uVar28 ^ 1L << (uVar29 & 0x3f);
                            uVar29 = 0;
                            if (uVar28 != 0) {
                              for (; (uVar28 >> uVar29 & 1) == 0; uVar29 = uVar29 + 1) {
                              }
                            }
                          } while (uVar28 != 0);
                          auVar8._8_8_ = p1.field_0._8_8_;
                          auVar8._0_8_ = p1.field_0._0_8_;
                          auVar53 = (undefined1  [16])p0.field_0.field_0.x.field_0;
                        }
                        auVar70._8_4_ = 0x3f800000;
                        auVar70._0_8_ = 0x3f8000003f800000;
                        auVar70._12_4_ = 0x3f800000;
                        auVar82 = vsubps_avx(auVar70,auVar138);
                        fVar105 = auVar82._0_4_;
                        fVar52 = fVar105 * (float)p0.field_0._16_4_;
                        fVar106 = auVar82._4_4_;
                        fVar75 = fVar106 * (float)p0.field_0._20_4_;
                        fVar107 = auVar82._8_4_;
                        fVar77 = fVar107 * (float)p0.field_0._24_4_;
                        fVar80 = auVar82._12_4_;
                        fVar79 = fVar80 * (float)p0.field_0._28_4_;
                        fVar191 = fVar105 * (float)p0.field_0._32_4_;
                        fVar202 = fVar106 * (float)p0.field_0._36_4_;
                        fVar198 = fVar107 * (float)p0.field_0._40_4_;
                        fVar200 = fVar80 * (float)p0.field_0._44_4_;
                        fVar210 = fVar40 * (float)p1.field_0._16_4_;
                        fVar233 = fVar49 * (float)p1.field_0._20_4_;
                        fVar235 = fVar81 * (float)p1.field_0._24_4_;
                        fVar212 = fVar104 * (float)p1.field_0._28_4_;
                        fVar41 = fVar40 * (float)p1.field_0._32_4_;
                        fVar109 = fVar49 * (float)p1.field_0._36_4_;
                        fVar50 = fVar81 * (float)p1.field_0._40_4_;
                        fVar132 = fVar104 * (float)p1.field_0._44_4_;
                        if (in_R10 != 0) {
                          lVar5 = *(long *)&pGVar4[2].numPrimitives;
                          uVar35 = (ulong)*(uint *)(lVar30 + 0x10 + uVar38 * 4);
                          uVar28 = in_R10;
                          uVar29 = uVar31;
                          do {
                            lVar34 = (long)itime.field_0.i[uVar29] * 0x38;
                            auVar82 = *(undefined1 (*) [16])(*(long *)(lVar5 + lVar34) + uVar35 * 4)
                            ;
                            auVar138 = *(undefined1 (*) [16])
                                        (*(long *)(lVar5 + 0x38 + lVar34) + uVar35 * 4);
                            *(int *)((long)&p0.field_0 + uVar29 * 4) = auVar82._0_4_;
                            uVar24 = vextractps_avx(auVar82,1);
                            *(undefined4 *)((long)&p0.field_0 + uVar29 * 4 + 0x10) = uVar24;
                            uVar24 = vextractps_avx(auVar82,2);
                            *(undefined4 *)((long)&p0.field_0 + uVar29 * 4 + 0x20) = uVar24;
                            *(int *)((long)&p1.field_0 + uVar29 * 4) = auVar138._0_4_;
                            uVar24 = vextractps_avx(auVar138,1);
                            *(undefined4 *)((long)&p1.field_0 + uVar29 * 4 + 0x10) = uVar24;
                            uVar24 = vextractps_avx(auVar138,2);
                            *(undefined4 *)((long)&p1.field_0 + uVar29 * 4 + 0x20) = uVar24;
                            uVar28 = uVar28 ^ 1L << (uVar29 & 0x3f);
                            uVar29 = 0;
                            if (uVar28 != 0) {
                              for (; (uVar28 >> uVar29 & 1) == 0; uVar29 = uVar29 + 1) {
                              }
                            }
                          } while (uVar28 != 0);
                          _local_37b8 = p0.field_0._0_16_;
                          local_3808 = (float)p1.field_0._0_8_;
                          fStack_3804 = (float)((ulong)p1.field_0._0_8_ >> 0x20);
                          fStack_3800 = (float)p1.field_0._8_8_;
                          fStack_37fc = (float)((ulong)p1.field_0._8_8_ >> 0x20);
                        }
                        fVar135 = fVar105 * (float)p0.field_0._16_4_;
                        fVar214 = fVar106 * (float)p0.field_0._20_4_;
                        fVar225 = fVar107 * (float)p0.field_0._24_4_;
                        fVar51 = fVar80 * (float)p0.field_0._28_4_;
                        fVar156 = fVar105 * (float)p0.field_0._32_4_;
                        fVar216 = fVar106 * (float)p0.field_0._36_4_;
                        fVar137 = fVar107 * (float)p0.field_0._40_4_;
                        fVar74 = fVar80 * (float)p0.field_0._44_4_;
                        fVar159 = fVar40 * (float)p1.field_0._16_4_;
                        fVar223 = fVar49 * (float)p1.field_0._20_4_;
                        fVar158 = fVar81 * (float)p1.field_0._24_4_;
                        fVar76 = fVar104 * (float)p1.field_0._28_4_;
                        fVar162 = fVar40 * (float)p1.field_0._32_4_;
                        fVar224 = fVar49 * (float)p1.field_0._36_4_;
                        fVar161 = fVar81 * (float)p1.field_0._40_4_;
                        fVar78 = fVar104 * (float)p1.field_0._44_4_;
                        auVar82 = in_ZMM15._0_16_;
                        if (in_R10 != 0) {
                          lVar5 = *(long *)&pGVar4[2].numPrimitives;
                          uVar35 = (ulong)*(uint *)(lVar30 + 0x20 + uVar38 * 4);
                          uVar28 = in_R10;
                          uVar29 = uVar31;
                          do {
                            lVar34 = (long)itime.field_0.i[uVar29] * 0x38;
                            auVar82 = *(undefined1 (*) [16])(*(long *)(lVar5 + lVar34) + uVar35 * 4)
                            ;
                            auVar138 = *(undefined1 (*) [16])
                                        (*(long *)(lVar5 + 0x38 + lVar34) + uVar35 * 4);
                            *(int *)((long)&p0.field_0 + uVar29 * 4) = auVar82._0_4_;
                            uVar24 = vextractps_avx(auVar82,1);
                            *(undefined4 *)((long)&p0.field_0 + uVar29 * 4 + 0x10) = uVar24;
                            uVar24 = vextractps_avx(auVar82,2);
                            *(undefined4 *)((long)&p0.field_0 + uVar29 * 4 + 0x20) = uVar24;
                            *(int *)((long)&p1.field_0 + uVar29 * 4) = auVar138._0_4_;
                            uVar24 = vextractps_avx(auVar138,1);
                            *(undefined4 *)((long)&p1.field_0 + uVar29 * 4 + 0x10) = uVar24;
                            uVar24 = vextractps_avx(auVar138,2);
                            *(undefined4 *)((long)&p1.field_0 + uVar29 * 4 + 0x20) = uVar24;
                            uVar28 = uVar28 ^ 1L << (uVar29 & 0x3f);
                            uVar29 = 0;
                            if (uVar28 != 0) {
                              for (; (uVar28 >> uVar29 & 1) == 0; uVar29 = uVar29 + 1) {
                              }
                            }
                          } while (uVar28 != 0);
                          auVar251._8_8_ = p1.field_0._8_8_;
                          auVar251._0_8_ = p1.field_0._0_8_;
                          auVar82 = (undefined1  [16])p0.field_0.field_0.x.field_0;
                        }
                        fVar136 = fVar105 * (float)p0.field_0._16_4_;
                        fVar157 = fVar106 * (float)p0.field_0._20_4_;
                        fVar160 = fVar107 * (float)p0.field_0._24_4_;
                        fVar163 = fVar80 * (float)p0.field_0._28_4_;
                        fVar108 = fVar105 * (float)p0.field_0._32_4_;
                        fVar131 = fVar106 * (float)p0.field_0._36_4_;
                        fVar133 = fVar107 * (float)p0.field_0._40_4_;
                        fVar134 = fVar80 * (float)p0.field_0._44_4_;
                        fVar192 = fVar40 * (float)p1.field_0._16_4_;
                        fVar197 = fVar49 * (float)p1.field_0._20_4_;
                        fVar199 = fVar81 * (float)p1.field_0._24_4_;
                        fVar201 = fVar104 * (float)p1.field_0._28_4_;
                        fVar203 = fVar40 * (float)p1.field_0._32_4_;
                        fVar211 = fVar49 * (float)p1.field_0._36_4_;
                        fVar213 = fVar81 * (float)p1.field_0._40_4_;
                        fVar215 = fVar104 * (float)p1.field_0._44_4_;
                        auVar138 = auVar102;
                        auVar222 = auVar217;
                        if (in_R10 != 0) {
                          lVar5 = *(long *)&pGVar4[2].numPrimitives;
                          uVar28 = (ulong)*(uint *)(lVar30 + 0x30 + uVar38 * 4);
                          uVar29 = in_R10;
                          do {
                            lVar34 = (long)itime.field_0.i[uVar31] * 0x38;
                            auVar138 = *(undefined1 (*) [16])
                                        (*(long *)(lVar5 + lVar34) + uVar28 * 4);
                            auVar118 = *(undefined1 (*) [16])
                                        (*(long *)(lVar5 + 0x38 + lVar34) + uVar28 * 4);
                            *(int *)((long)&p0.field_0 + uVar31 * 4) = auVar138._0_4_;
                            uVar24 = vextractps_avx(auVar138,1);
                            *(undefined4 *)((long)&p0.field_0 + uVar31 * 4 + 0x10) = uVar24;
                            uVar24 = vextractps_avx(auVar138,2);
                            *(undefined4 *)((long)&p0.field_0 + uVar31 * 4 + 0x20) = uVar24;
                            *(int *)((long)&p1.field_0 + uVar31 * 4) = auVar118._0_4_;
                            uVar24 = vextractps_avx(auVar118,1);
                            *(undefined4 *)((long)&p1.field_0 + uVar31 * 4 + 0x10) = uVar24;
                            uVar24 = vextractps_avx(auVar118,2);
                            *(undefined4 *)((long)&p1.field_0 + uVar31 * 4 + 0x20) = uVar24;
                            uVar29 = uVar29 ^ 1L << (uVar31 & 0x3f);
                            uVar31 = 0;
                            if (uVar29 != 0) {
                              for (; (uVar29 >> uVar31 & 1) == 0; uVar31 = uVar31 + 1) {
                              }
                            }
                          } while (uVar29 != 0);
                          auVar222._8_8_ = p1.field_0._8_8_;
                          auVar222._0_8_ = p1.field_0._0_8_;
                          auVar138 = (undefined1  [16])p0.field_0.field_0.x.field_0;
                        }
                        auVar130._0_4_ = fVar105 * auVar53._0_4_ + fVar40 * auVar8._0_4_;
                        auVar130._4_4_ = fVar106 * auVar53._4_4_ + fVar49 * auVar8._4_4_;
                        auVar130._8_4_ = fVar107 * auVar53._8_4_ + fVar81 * auVar8._8_4_;
                        auVar130._12_4_ = fVar80 * auVar53._12_4_ + fVar104 * auVar8._12_4_;
                        auVar253._0_4_ = fVar52 + fVar210;
                        auVar253._4_4_ = fVar75 + fVar233;
                        auVar253._8_4_ = fVar77 + fVar235;
                        auVar253._12_4_ = fVar79 + fVar212;
                        auVar142._0_4_ = fVar191 + fVar41;
                        auVar142._4_4_ = fVar202 + fVar109;
                        auVar142._8_4_ = fVar198 + fVar50;
                        auVar142._12_4_ = fVar200 + fVar132;
                        local_3808 = fVar105 * (float)local_37b8._0_4_ + fVar40 * local_3808;
                        fStack_3804 = fVar106 * (float)local_37b8._4_4_ + fVar49 * fStack_3804;
                        fStack_3800 = fVar107 * fStack_37b0 + fVar81 * fStack_3800;
                        fStack_37fc = fVar80 * fStack_37ac + fVar104 * fStack_37fc;
                        local_38a8._4_4_ = fVar223 + fVar214;
                        local_38a8._0_4_ = fVar159 + fVar135;
                        fStack_38a0 = fVar158 + fVar225;
                        fStack_389c = fVar76 + fVar51;
                        local_3898._4_4_ = fVar224 + fVar216;
                        local_3898._0_4_ = fVar162 + fVar156;
                        fStack_3890 = fVar161 + fVar137;
                        fStack_388c = fVar78 + fVar74;
                        local_36c8._4_4_ = auVar82._4_4_ * fVar106 + auVar251._4_4_ * fVar49;
                        local_36c8._0_4_ = auVar82._0_4_ * fVar105 + auVar251._0_4_ * fVar40;
                        fStack_36c0 = auVar82._8_4_ * fVar107 + auVar251._8_4_ * fVar81;
                        fStack_36bc = auVar82._12_4_ * fVar80 + auVar251._12_4_ * fVar104;
                        local_36d8._4_4_ = fVar157 + fVar197;
                        local_36d8._0_4_ = fVar136 + fVar192;
                        fStack_36d0 = fVar160 + fVar199;
                        fStack_36cc = fVar163 + fVar201;
                        local_36e8._4_4_ = fVar211 + fVar131;
                        local_36e8._0_4_ = fVar203 + fVar108;
                        fStack_36e0 = fVar213 + fVar133;
                        fStack_36dc = fVar215 + fVar134;
                        auVar206._0_4_ = auVar138._0_4_ * fVar105 + auVar222._0_4_ * fVar40;
                        auVar206._4_4_ = auVar138._4_4_ * fVar106 + auVar222._4_4_ * fVar49;
                        auVar206._8_4_ = auVar138._8_4_ * fVar107 + auVar222._8_4_ * fVar81;
                        auVar206._12_4_ = auVar138._12_4_ * fVar80 + auVar222._12_4_ * fVar104;
                        auVar182._0_4_ =
                             fVar105 * (float)p0.field_0._16_4_ + fVar40 * (float)p1.field_0._16_4_;
                        auVar182._4_4_ =
                             fVar106 * (float)p0.field_0._20_4_ + fVar49 * (float)p1.field_0._20_4_;
                        auVar182._8_4_ =
                             fVar107 * (float)p0.field_0._24_4_ + fVar81 * (float)p1.field_0._24_4_;
                        auVar182._12_4_ =
                             fVar80 * (float)p0.field_0._28_4_ + fVar104 * (float)p1.field_0._28_4_;
                        auVar56._0_4_ =
                             fVar105 * (float)p0.field_0._32_4_ + fVar40 * (float)p1.field_0._32_4_;
                        auVar56._4_4_ =
                             fVar106 * (float)p0.field_0._36_4_ + fVar49 * (float)p1.field_0._36_4_;
                        auVar56._8_4_ =
                             fVar107 * (float)p0.field_0._40_4_ + fVar81 * (float)p1.field_0._40_4_;
                        auVar56._12_4_ =
                             fVar80 * (float)p0.field_0._44_4_ + fVar104 * (float)p1.field_0._44_4_;
                      }
                      auVar82 = *(undefined1 (*) [16])ray;
                      auVar138 = *(undefined1 (*) [16])(ray + 0x10);
                      auVar53 = *(undefined1 (*) [16])(ray + 0x20);
                      auVar118 = vsubps_avx(auVar130,auVar82);
                      auVar164 = vsubps_avx(auVar253,auVar138);
                      _local_37b8 = vsubps_avx(auVar142,auVar53);
                      auVar177 = vsubps_avx(auVar206,auVar82);
                      auVar178 = vsubps_avx(auVar182,auVar138);
                      auVar204 = vsubps_avx(auVar56,auVar53);
                      auVar94 = vsubps_avx(auVar177,auVar118);
                      auVar119 = vsubps_avx(auVar178,auVar164);
                      auVar238 = vsubps_avx(auVar204,_local_37b8);
                      fVar40 = auVar164._0_4_;
                      fVar135 = auVar178._0_4_ + fVar40;
                      fVar104 = auVar164._4_4_;
                      fVar156 = auVar178._4_4_ + fVar104;
                      fVar107 = auVar164._8_4_;
                      fVar159 = auVar178._8_4_ + fVar107;
                      fVar109 = auVar164._12_4_;
                      fVar162 = auVar178._12_4_ + fVar109;
                      fVar49 = local_37b8._0_4_;
                      fVar202 = auVar204._0_4_ + fVar49;
                      fVar105 = local_37b8._4_4_;
                      fVar210 = auVar204._4_4_ + fVar105;
                      fVar80 = local_37b8._8_4_;
                      fVar212 = auVar204._8_4_ + fVar80;
                      fVar50 = local_37b8._12_4_;
                      fVar214 = auVar204._12_4_ + fVar50;
                      fVar52 = auVar238._0_4_;
                      auVar218._0_4_ = fVar135 * fVar52;
                      fVar79 = auVar238._4_4_;
                      auVar218._4_4_ = fVar156 * fVar79;
                      fVar198 = auVar238._8_4_;
                      auVar218._8_4_ = fVar159 * fVar198;
                      fVar233 = auVar238._12_4_;
                      auVar218._12_4_ = fVar162 * fVar233;
                      fVar75 = auVar119._0_4_;
                      auVar227._0_4_ = fVar202 * fVar75;
                      fVar191 = auVar119._4_4_;
                      auVar227._4_4_ = fVar210 * fVar191;
                      fVar200 = auVar119._8_4_;
                      auVar227._8_4_ = fVar212 * fVar200;
                      fVar235 = auVar119._12_4_;
                      auVar227._12_4_ = fVar214 * fVar235;
                      auVar119 = vsubps_avx(auVar227,auVar218);
                      fVar81 = auVar118._0_4_;
                      fVar216 = auVar177._0_4_ + fVar81;
                      fVar106 = auVar118._4_4_;
                      fVar223 = auVar177._4_4_ + fVar106;
                      fVar41 = auVar118._8_4_;
                      fVar224 = auVar177._8_4_ + fVar41;
                      fVar132 = auVar118._12_4_;
                      fVar225 = auVar177._12_4_ + fVar132;
                      fVar77 = auVar94._0_4_;
                      auVar207._0_4_ = fVar202 * fVar77;
                      fVar202 = auVar94._4_4_;
                      auVar207._4_4_ = fVar210 * fVar202;
                      fVar210 = auVar94._8_4_;
                      auVar207._8_4_ = fVar212 * fVar210;
                      fVar212 = auVar94._12_4_;
                      auVar207._12_4_ = fVar214 * fVar212;
                      auVar228._0_4_ = fVar216 * fVar52;
                      auVar228._4_4_ = fVar223 * fVar79;
                      auVar228._8_4_ = fVar224 * fVar198;
                      auVar228._12_4_ = fVar225 * fVar233;
                      auVar94 = vsubps_avx(auVar228,auVar207);
                      auVar208._0_4_ = fVar216 * fVar75;
                      auVar208._4_4_ = fVar223 * fVar191;
                      auVar208._8_4_ = fVar224 * fVar200;
                      auVar208._12_4_ = fVar225 * fVar235;
                      auVar143._0_4_ = fVar77 * fVar135;
                      auVar143._4_4_ = fVar202 * fVar156;
                      auVar143._8_4_ = fVar210 * fVar159;
                      auVar143._12_4_ = fVar212 * fVar162;
                      auVar238 = vsubps_avx(auVar143,auVar208);
                      fVar135 = *(float *)(ray + 0x60);
                      fVar156 = *(float *)(ray + 100);
                      fVar159 = *(float *)(ray + 0x68);
                      auVar16 = *(undefined1 (*) [12])(ray + 0x60);
                      fVar162 = *(float *)(ray + 0x6c);
                      fVar214 = *(float *)(ray + 0x50);
                      fVar216 = *(float *)(ray + 0x54);
                      fVar223 = *(float *)(ray + 0x58);
                      auVar17 = *(undefined1 (*) [12])(ray + 0x50);
                      fVar224 = *(float *)(ray + 0x5c);
                      fVar225 = *(float *)(ray + 0x40);
                      fVar137 = *(float *)(ray + 0x44);
                      fVar158 = *(float *)(ray + 0x48);
                      auVar18 = *(undefined1 (*) [12])(ray + 0x40);
                      fVar161 = *(float *)(ray + 0x4c);
                      auVar219._0_4_ =
                           fVar225 * auVar119._0_4_ +
                           auVar94._0_4_ * fVar214 + fVar135 * auVar238._0_4_;
                      auVar219._4_4_ =
                           fVar137 * auVar119._4_4_ +
                           auVar94._4_4_ * fVar216 + fVar156 * auVar238._4_4_;
                      auVar219._8_4_ =
                           fVar158 * auVar119._8_4_ +
                           auVar94._8_4_ * fVar223 + fVar159 * auVar238._8_4_;
                      auVar219._12_4_ =
                           fVar161 * auVar119._12_4_ +
                           auVar94._12_4_ * fVar224 + fVar162 * auVar238._12_4_;
                      auVar138 = vsubps_avx(_local_38a8,auVar138);
                      auVar53 = vsubps_avx(_local_3898,auVar53);
                      auVar164 = vsubps_avx(auVar164,auVar138);
                      auVar94 = vsubps_avx(_local_37b8,auVar53);
                      fVar136 = fVar40 + auVar138._0_4_;
                      fVar157 = fVar104 + auVar138._4_4_;
                      fVar160 = fVar107 + auVar138._8_4_;
                      fVar163 = fVar109 + auVar138._12_4_;
                      fVar51 = fVar49 + auVar53._0_4_;
                      fVar74 = fVar105 + auVar53._4_4_;
                      fVar76 = fVar80 + auVar53._8_4_;
                      fVar78 = fVar50 + auVar53._12_4_;
                      fVar197 = auVar94._0_4_;
                      auVar83._0_4_ = fVar197 * fVar136;
                      fVar199 = auVar94._4_4_;
                      auVar83._4_4_ = fVar199 * fVar157;
                      fVar201 = auVar94._8_4_;
                      auVar83._8_4_ = fVar201 * fVar160;
                      fVar203 = auVar94._12_4_;
                      auVar83._12_4_ = fVar203 * fVar163;
                      fVar243 = auVar164._0_4_;
                      auVar112._0_4_ = fVar243 * fVar51;
                      fVar245 = auVar164._4_4_;
                      auVar112._4_4_ = fVar245 * fVar74;
                      fVar247 = auVar164._8_4_;
                      auVar112._8_4_ = fVar247 * fVar76;
                      fVar249 = auVar164._12_4_;
                      auVar112._12_4_ = fVar249 * fVar78;
                      auVar164 = vsubps_avx(auVar112,auVar83);
                      auVar13._4_4_ = fStack_3804;
                      auVar13._0_4_ = local_3808;
                      auVar13._8_4_ = fStack_3800;
                      auVar13._12_4_ = fStack_37fc;
                      auVar82 = vsubps_avx(auVar13,auVar82);
                      auVar118 = vsubps_avx(auVar118,auVar82);
                      fVar211 = auVar118._0_4_;
                      auVar57._0_4_ = fVar211 * fVar51;
                      fVar213 = auVar118._4_4_;
                      auVar57._4_4_ = fVar213 * fVar74;
                      fVar215 = auVar118._8_4_;
                      auVar57._8_4_ = fVar215 * fVar76;
                      fVar226 = auVar118._12_4_;
                      auVar57._12_4_ = fVar226 * fVar78;
                      fVar51 = fVar81 + auVar82._0_4_;
                      fVar74 = fVar106 + auVar82._4_4_;
                      fVar76 = fVar41 + auVar82._8_4_;
                      fVar78 = fVar132 + auVar82._12_4_;
                      auVar209._0_4_ = fVar197 * fVar51;
                      auVar209._4_4_ = fVar199 * fVar74;
                      auVar209._8_4_ = fVar201 * fVar76;
                      auVar209._12_4_ = fVar203 * fVar78;
                      auVar118 = vsubps_avx(auVar209,auVar57);
                      auVar194._0_4_ = fVar243 * fVar51;
                      auVar194._4_4_ = fVar245 * fVar74;
                      auVar194._8_4_ = fVar247 * fVar76;
                      auVar194._12_4_ = fVar249 * fVar78;
                      auVar144._0_4_ = fVar211 * fVar136;
                      auVar144._4_4_ = fVar213 * fVar157;
                      auVar144._8_4_ = fVar215 * fVar160;
                      auVar144._12_4_ = fVar226 * fVar163;
                      auVar94 = vsubps_avx(auVar144,auVar194);
                      auVar195._0_4_ =
                           fVar225 * auVar164._0_4_ +
                           fVar135 * auVar94._0_4_ + fVar214 * auVar118._0_4_;
                      auVar195._4_4_ =
                           fVar137 * auVar164._4_4_ +
                           fVar156 * auVar94._4_4_ + fVar216 * auVar118._4_4_;
                      auVar195._8_4_ =
                           fVar158 * auVar164._8_4_ +
                           fVar159 * auVar94._8_4_ + fVar223 * auVar118._8_4_;
                      auVar195._12_4_ =
                           fVar161 * auVar164._12_4_ +
                           fVar162 * auVar94._12_4_ + fVar224 * auVar118._12_4_;
                      auVar118 = vsubps_avx(auVar82,auVar177);
                      fVar51 = auVar177._0_4_ + auVar82._0_4_;
                      fVar74 = auVar177._4_4_ + auVar82._4_4_;
                      fVar76 = auVar177._8_4_ + auVar82._8_4_;
                      fVar78 = auVar177._12_4_ + auVar82._12_4_;
                      auVar164 = vsubps_avx(auVar138,auVar178);
                      in_ZMM15 = ZEXT1664(auVar164);
                      fVar136 = auVar138._0_4_ + auVar178._0_4_;
                      fVar157 = auVar138._4_4_ + auVar178._4_4_;
                      fVar160 = auVar138._8_4_ + auVar178._8_4_;
                      fVar163 = auVar138._12_4_ + auVar178._12_4_;
                      auVar82 = vsubps_avx(auVar53,auVar204);
                      fVar108 = auVar53._0_4_ + auVar204._0_4_;
                      fVar131 = auVar53._4_4_ + auVar204._4_4_;
                      fVar133 = auVar53._8_4_ + auVar204._8_4_;
                      fVar134 = auVar53._12_4_ + auVar204._12_4_;
                      fVar234 = auVar82._0_4_;
                      auVar169._0_4_ = fVar234 * fVar136;
                      fVar236 = auVar82._4_4_;
                      auVar169._4_4_ = fVar236 * fVar157;
                      fVar237 = auVar82._8_4_;
                      auVar169._8_4_ = fVar237 * fVar160;
                      fVar242 = auVar82._12_4_;
                      auVar169._12_4_ = fVar242 * fVar163;
                      fVar244 = auVar164._0_4_;
                      auVar183._0_4_ = fVar244 * fVar108;
                      fVar246 = auVar164._4_4_;
                      auVar183._4_4_ = fVar246 * fVar131;
                      fVar248 = auVar164._8_4_;
                      auVar183._8_4_ = fVar248 * fVar133;
                      fVar256 = auVar164._12_4_;
                      auVar183._12_4_ = fVar256 * fVar134;
                      auVar82 = vsubps_avx(auVar183,auVar169);
                      fVar192 = auVar118._0_4_;
                      auVar113._0_4_ = fVar192 * fVar108;
                      fVar108 = auVar118._4_4_;
                      auVar113._4_4_ = fVar108 * fVar131;
                      fVar131 = auVar118._8_4_;
                      auVar113._8_4_ = fVar131 * fVar133;
                      fVar133 = auVar118._12_4_;
                      auVar113._12_4_ = fVar133 * fVar134;
                      auVar184._0_4_ = fVar234 * fVar51;
                      auVar184._4_4_ = fVar236 * fVar74;
                      auVar184._8_4_ = fVar237 * fVar76;
                      auVar184._12_4_ = fVar242 * fVar78;
                      auVar138 = vsubps_avx(auVar184,auVar113);
                      auVar58._0_4_ = fVar244 * fVar51;
                      auVar58._4_4_ = fVar246 * fVar74;
                      auVar58._8_4_ = fVar248 * fVar76;
                      auVar58._12_4_ = fVar256 * fVar78;
                      auVar84._0_4_ = fVar192 * fVar136;
                      auVar84._4_4_ = fVar108 * fVar157;
                      auVar84._8_4_ = fVar131 * fVar160;
                      auVar84._12_4_ = fVar133 * fVar163;
                      auVar53 = vsubps_avx(auVar84,auVar58);
                      auVar59._0_4_ =
                           fVar225 * auVar82._0_4_ +
                           fVar135 * auVar53._0_4_ + fVar214 * auVar138._0_4_;
                      auVar59._4_4_ =
                           fVar137 * auVar82._4_4_ +
                           fVar156 * auVar53._4_4_ + fVar216 * auVar138._4_4_;
                      auVar59._8_4_ =
                           fVar158 * auVar82._8_4_ +
                           fVar159 * auVar53._8_4_ + fVar223 * auVar138._8_4_;
                      auVar59._12_4_ =
                           fVar161 * auVar82._12_4_ +
                           fVar162 * auVar53._12_4_ + fVar224 * auVar138._12_4_;
                      auVar44._0_4_ = auVar59._0_4_ + auVar219._0_4_ + auVar195._0_4_;
                      auVar44._4_4_ = auVar59._4_4_ + auVar219._4_4_ + auVar195._4_4_;
                      auVar44._8_4_ = auVar59._8_4_ + auVar219._8_4_ + auVar195._8_4_;
                      auVar44._12_4_ = auVar59._12_4_ + auVar219._12_4_ + auVar195._12_4_;
                      auVar82 = vminps_avx(auVar219,auVar195);
                      auVar138 = vminps_avx(auVar82,auVar59);
                      auVar185._8_4_ = 0x7fffffff;
                      auVar185._0_8_ = 0x7fffffff7fffffff;
                      auVar185._12_4_ = 0x7fffffff;
                      auVar82 = vandps_avx(auVar44,auVar185);
                      auVar114._0_4_ = auVar82._0_4_ * 1.1920929e-07;
                      auVar114._4_4_ = auVar82._4_4_ * 1.1920929e-07;
                      auVar114._8_4_ = auVar82._8_4_ * 1.1920929e-07;
                      auVar114._12_4_ = auVar82._12_4_ * 1.1920929e-07;
                      uVar31 = CONCAT44(auVar114._4_4_,auVar114._0_4_);
                      auVar170._0_8_ = uVar31 ^ 0x8000000080000000;
                      auVar170._8_4_ = -auVar114._8_4_;
                      auVar170._12_4_ = -auVar114._12_4_;
                      auVar138 = vcmpps_avx(auVar138,auVar170,5);
                      auVar53 = vmaxps_avx(auVar219,auVar195);
                      auVar53 = vmaxps_avx(auVar53,auVar59);
                      auVar53 = vcmpps_avx(auVar53,auVar114,2);
                      auVar138 = vorps_avx(auVar138,auVar53);
                      in_ZMM13 = ZEXT1664(auVar138);
                      auVar53 = auVar102 & auVar138;
                      if ((((auVar53 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                           (auVar53 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          (auVar53 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                          auVar53[0xf] < '\0') {
                        auVar60._0_4_ = fVar243 * fVar52;
                        auVar60._4_4_ = fVar245 * fVar79;
                        auVar60._8_4_ = fVar247 * fVar198;
                        auVar60._12_4_ = fVar249 * fVar233;
                        auVar85._0_4_ = fVar197 * fVar75;
                        auVar85._4_4_ = fVar199 * fVar191;
                        auVar85._8_4_ = fVar201 * fVar200;
                        auVar85._12_4_ = fVar203 * fVar235;
                        auVar177 = vsubps_avx(auVar85,auVar60);
                        auVar115._0_4_ = fVar244 * fVar197;
                        auVar115._4_4_ = fVar246 * fVar199;
                        auVar115._8_4_ = fVar248 * fVar201;
                        auVar115._12_4_ = fVar256 * fVar203;
                        auVar171._0_4_ = fVar243 * fVar234;
                        auVar171._4_4_ = fVar245 * fVar236;
                        auVar171._8_4_ = fVar247 * fVar237;
                        auVar171._12_4_ = fVar249 * fVar242;
                        auVar178 = vsubps_avx(auVar171,auVar115);
                        auVar53 = vandps_avx(auVar60,auVar185);
                        auVar118 = vandps_avx(auVar115,auVar185);
                        auVar53 = vcmpps_avx(auVar53,auVar118,1);
                        auVar178 = vblendvps_avx(auVar178,auVar177,auVar53);
                        auVar61._0_4_ = fVar211 * fVar234;
                        auVar61._4_4_ = fVar213 * fVar236;
                        auVar61._8_4_ = fVar215 * fVar237;
                        auVar61._12_4_ = fVar226 * fVar242;
                        auVar86._0_4_ = fVar211 * fVar52;
                        auVar86._4_4_ = fVar213 * fVar79;
                        auVar86._8_4_ = fVar215 * fVar198;
                        auVar86._12_4_ = fVar226 * fVar233;
                        auVar116._0_4_ = fVar77 * fVar197;
                        auVar116._4_4_ = fVar202 * fVar199;
                        auVar116._8_4_ = fVar210 * fVar201;
                        auVar116._12_4_ = fVar212 * fVar203;
                        auVar177 = vsubps_avx(auVar86,auVar116);
                        auVar172._0_4_ = fVar197 * fVar192;
                        auVar172._4_4_ = fVar199 * fVar108;
                        auVar172._8_4_ = fVar201 * fVar131;
                        auVar172._12_4_ = fVar203 * fVar133;
                        auVar204 = vsubps_avx(auVar172,auVar61);
                        auVar53 = vandps_avx(auVar116,auVar185);
                        auVar118 = vandps_avx(auVar61,auVar185);
                        auVar53 = vcmpps_avx(auVar53,auVar118,1);
                        auVar204 = vblendvps_avx(auVar204,auVar177,auVar53);
                        auVar62._0_4_ = fVar243 * fVar192;
                        auVar62._4_4_ = fVar245 * fVar108;
                        auVar62._8_4_ = fVar247 * fVar131;
                        auVar62._12_4_ = fVar249 * fVar133;
                        auVar87._0_4_ = fVar77 * fVar243;
                        auVar87._4_4_ = fVar202 * fVar245;
                        auVar87._8_4_ = fVar210 * fVar247;
                        auVar87._12_4_ = fVar212 * fVar249;
                        auVar117._0_4_ = fVar211 * fVar75;
                        auVar117._4_4_ = fVar213 * fVar191;
                        auVar117._8_4_ = fVar215 * fVar200;
                        auVar117._12_4_ = fVar226 * fVar235;
                        auVar45._0_4_ = fVar211 * fVar244;
                        auVar45._4_4_ = fVar213 * fVar246;
                        auVar45._8_4_ = fVar215 * fVar248;
                        auVar45._12_4_ = fVar226 * fVar256;
                        auVar177 = vsubps_avx(auVar87,auVar117);
                        auVar94 = vsubps_avx(auVar45,auVar62);
                        auVar53 = vandps_avx(auVar117,auVar185);
                        auVar118 = vandps_avx(auVar62,auVar185);
                        auVar53 = vcmpps_avx(auVar53,auVar118,1);
                        auVar94 = vblendvps_avx(auVar94,auVar177,auVar53);
                        local_37e8 = auVar16._0_4_;
                        fStack_37e4 = auVar16._4_4_;
                        fStack_37e0 = auVar16._8_4_;
                        local_37f8 = auVar17._0_4_;
                        fStack_37f4 = auVar17._4_4_;
                        fStack_37f0 = auVar17._8_4_;
                        local_3698 = auVar18._0_4_;
                        fStack_3694 = auVar18._4_4_;
                        fStack_3690 = auVar18._8_4_;
                        fVar52 = auVar178._0_4_ * local_3698 +
                                 auVar94._0_4_ * local_37e8 + auVar204._0_4_ * local_37f8;
                        fVar75 = auVar178._4_4_ * fStack_3694 +
                                 auVar94._4_4_ * fStack_37e4 + auVar204._4_4_ * fStack_37f4;
                        fVar77 = auVar178._8_4_ * fStack_3690 +
                                 auVar94._8_4_ * fStack_37e0 + auVar204._8_4_ * fStack_37f0;
                        fVar79 = auVar178._12_4_ * fVar161 +
                                 auVar94._12_4_ * fVar162 + auVar204._12_4_ * fVar224;
                        auVar63._0_4_ = fVar52 + fVar52;
                        auVar63._4_4_ = fVar75 + fVar75;
                        auVar63._8_4_ = fVar77 + fVar77;
                        auVar63._12_4_ = fVar79 + fVar79;
                        fVar52 = auVar178._0_4_ * fVar81 +
                                 auVar94._0_4_ * fVar49 + auVar204._0_4_ * fVar40;
                        fVar105 = auVar178._4_4_ * fVar106 +
                                  auVar94._4_4_ * fVar105 + auVar204._4_4_ * fVar104;
                        fVar106 = auVar178._8_4_ * fVar41 +
                                  auVar94._8_4_ * fVar80 + auVar204._8_4_ * fVar107;
                        fVar107 = auVar178._12_4_ * fVar132 +
                                  auVar94._12_4_ * fVar50 + auVar204._12_4_ * fVar109;
                        auVar53 = vrcpps_avx(auVar63);
                        fVar40 = auVar53._0_4_;
                        auVar145._0_4_ = auVar63._0_4_ * fVar40;
                        fVar49 = auVar53._4_4_;
                        auVar145._4_4_ = auVar63._4_4_ * fVar49;
                        fVar81 = auVar53._8_4_;
                        auVar145._8_4_ = auVar63._8_4_ * fVar81;
                        fVar104 = auVar53._12_4_;
                        auVar145._12_4_ = auVar63._12_4_ * fVar104;
                        auVar173._8_4_ = 0x3f800000;
                        auVar173._0_8_ = 0x3f8000003f800000;
                        auVar173._12_4_ = 0x3f800000;
                        auVar53 = vsubps_avx(auVar173,auVar145);
                        auVar88._0_4_ = (fVar52 + fVar52) * (fVar40 + fVar40 * auVar53._0_4_);
                        auVar88._4_4_ = (fVar105 + fVar105) * (fVar49 + fVar49 * auVar53._4_4_);
                        auVar88._8_4_ = (fVar106 + fVar106) * (fVar81 + fVar81 * auVar53._8_4_);
                        auVar88._12_4_ = (fVar107 + fVar107) * (fVar104 + fVar104 * auVar53._12_4_);
                        auVar53 = *(undefined1 (*) [16])(ray + 0x80);
                        auVar118 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar88,2);
                        auVar177 = vcmpps_avx(auVar88,auVar53,2);
                        auVar118 = vandps_avx(auVar118,auVar177);
                        auVar177 = vcmpps_avx(auVar63,ZEXT816(0) << 0x20,4);
                        auVar118 = vandps_avx(auVar177,auVar118);
                        auVar177 = vandps_avx(auVar138,auVar102);
                        auVar118 = vpslld_avx(auVar118,0x1f);
                        auVar119 = vpsrad_avx(auVar118,0x1f);
                        auVar118 = auVar177 & auVar119;
                        if ((((auVar118 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                             (auVar118 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            (auVar118 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            auVar118[0xf] < '\0') {
                          auVar118 = vandps_avx(auVar119,auVar177);
                          uVar2 = pGVar4->mask;
                          auVar120._4_4_ = uVar2;
                          auVar120._0_4_ = uVar2;
                          auVar120._8_4_ = uVar2;
                          auVar120._12_4_ = uVar2;
                          auVar177 = vandps_avx(auVar120,*(undefined1 (*) [16])(ray + 0x90));
                          auVar177 = vpcmpeqd_avx(auVar177,ZEXT816(0) << 0x20);
                          auVar119 = auVar118 & ~auVar177;
                          if ((((auVar119 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0
                               || (auVar119 >> 0x3f & (undefined1  [16])0x1) !=
                                  (undefined1  [16])0x0) ||
                              (auVar119 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0)
                              || auVar119[0xf] < '\0') {
                            aVar71 = (anon_union_16_2_9473010e_for_vint_impl<4>_1)
                                     vandnps_avx(auVar177,auVar118);
                            if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                               (pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                              auVar118 = vrcpps_avx(auVar44);
                              fVar40 = auVar118._0_4_;
                              auVar153._0_4_ = auVar44._0_4_ * fVar40;
                              fVar49 = auVar118._4_4_;
                              auVar153._4_4_ = auVar44._4_4_ * fVar49;
                              fVar81 = auVar118._8_4_;
                              auVar153._8_4_ = auVar44._8_4_ * fVar81;
                              fVar104 = auVar118._12_4_;
                              auVar153._12_4_ = auVar44._12_4_ * fVar104;
                              auVar189._8_4_ = 0x3f800000;
                              auVar189._0_8_ = 0x3f8000003f800000;
                              auVar189._12_4_ = 0x3f800000;
                              auVar118 = vsubps_avx(auVar189,auVar153);
                              auVar125._0_4_ = fVar40 + fVar40 * auVar118._0_4_;
                              auVar125._4_4_ = fVar49 + fVar49 * auVar118._4_4_;
                              auVar125._8_4_ = fVar81 + fVar81 * auVar118._8_4_;
                              auVar125._12_4_ = fVar104 + fVar104 * auVar118._12_4_;
                              auVar154._8_4_ = 0x219392ef;
                              auVar154._0_8_ = 0x219392ef219392ef;
                              auVar154._12_4_ = 0x219392ef;
                              auVar82 = vcmpps_avx(auVar82,auVar154,5);
                              auVar82 = vandps_avx(auVar82,auVar125);
                              auVar155._0_4_ = auVar82._0_4_ * auVar219._0_4_;
                              auVar155._4_4_ = auVar82._4_4_ * auVar219._4_4_;
                              auVar155._8_4_ = auVar82._8_4_ * auVar219._8_4_;
                              auVar155._12_4_ = auVar82._12_4_ * auVar219._12_4_;
                              auVar118 = vminps_avx(auVar155,auVar189);
                              auVar126._0_4_ = auVar82._0_4_ * auVar195._0_4_;
                              auVar126._4_4_ = auVar82._4_4_ * auVar195._4_4_;
                              auVar126._8_4_ = auVar82._8_4_ * auVar195._8_4_;
                              auVar126._12_4_ = auVar82._12_4_ * auVar195._12_4_;
                              auVar82 = vminps_avx(auVar126,auVar189);
                              auVar177 = vsubps_avx(auVar189,auVar118);
                              auVar119 = vsubps_avx(auVar189,auVar82);
                              auVar15._8_8_ = uVar20;
                              auVar15._0_8_ = uVar19;
                              vblendvps_avx(auVar118,auVar177,auVar15);
                              vblendvps_avx(auVar82,auVar119,auVar15);
                              vpshufd_avx(ZEXT416(uVar3),0);
                              vpshufd_avx(ZEXT416(uVar23),0);
                              p0.field_0._0_16_ = auVar178;
                              p0.field_0._16_16_ = auVar204;
                              p0.field_0._32_16_ = auVar94;
                              vcmpps_avx(ZEXT1632(auVar94),ZEXT1632(auVar94),0xf);
                              auVar82 = vblendvps_avx(auVar53,auVar88,(undefined1  [16])aVar71);
                              *(undefined1 (*) [16])(ray + 0x80) = auVar82;
                              itime.field_0 = aVar71;
                              p1.field_0._0_8_ = &itime;
                              p1.field_0._8_8_ = pGVar4->userPtr;
                              p1.field_0._16_8_ = context->user;
                              p1.field_0._24_8_ = ray;
                              p1.field_0._32_8_ = &p0;
                              p1.field_0._40_4_ = 4;
                              if (pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                                in_ZMM13 = ZEXT1664(auVar138);
                                in_ZMM15 = ZEXT1664(auVar164);
                                (*pGVar4->occlusionFilterN)((RTCFilterFunctionNArguments *)&p1);
                              }
                              if (itime.field_0 == (anon_union_16_2_9473010e_for_vint_impl<4>_1)0x0)
                              {
                                auVar82 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
                                auVar82 = auVar82 ^ _DAT_01f7ae20;
                              }
                              else {
                                p_Var6 = context->args->filter;
                                auVar82 = ZEXT816(0) << 0x40;
                                if ((p_Var6 != (RTCFilterFunctionN)0x0) &&
                                   (((context->args->flags &
                                     RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                     RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                    (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
                                  in_ZMM13 = ZEXT1664(in_ZMM13._0_16_);
                                  in_ZMM15 = ZEXT1664(in_ZMM15._0_16_);
                                  (*p_Var6)((RTCFilterFunctionNArguments *)&p1);
                                  auVar82 = ZEXT816(0) << 0x40;
                                }
                                auVar138 = vpcmpeqd_avx((undefined1  [16])itime.field_0,auVar82);
                                auVar82 = vpcmpeqd_avx(auVar82,auVar82);
                                auVar82 = auVar138 ^ auVar82;
                                auVar100._8_4_ = 0xff800000;
                                auVar100._0_8_ = 0xff800000ff800000;
                                auVar100._12_4_ = 0xff800000;
                                auVar138 = vblendvps_avx(auVar100,*(undefined1 (*) [16])
                                                                   (p1.field_0._24_8_ + 0x80),
                                                         auVar138);
                                *(undefined1 (*) [16])(p1.field_0._24_8_ + 0x80) = auVar138;
                              }
                              auVar82 = vpslld_avx(auVar82,0x1f);
                              aVar71 = (anon_union_16_2_9473010e_for_vint_impl<4>_1)
                                       vpsrad_avx(auVar82,0x1f);
                              auVar82 = vblendvps_avx(auVar53,*(undefined1 (*) [16])pRVar1,auVar82);
                              *(undefined1 (*) [16])pRVar1 = auVar82;
                            }
                            auVar102 = vpandn_avx((undefined1  [16])aVar71,auVar102);
                          }
                        }
                      }
                      auVar12._4_4_ = fStack_3804;
                      auVar12._0_4_ = local_3808;
                      auVar12._8_4_ = fStack_3800;
                      auVar12._12_4_ = fStack_37fc;
                      auVar103 = ZEXT1664(auVar12);
                      if ((((auVar102 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                           (auVar102 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar102 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          -1 < auVar102[0xf]) break;
                      auVar82 = *(undefined1 (*) [16])ray;
                      auVar138 = *(undefined1 (*) [16])(ray + 0x10);
                      auVar53 = *(undefined1 (*) [16])(ray + 0x20);
                      auVar118 = vsubps_avx(_local_36c8,auVar82);
                      auVar164 = vsubps_avx(_local_36d8,auVar138);
                      auVar177 = vsubps_avx(_local_36e8,auVar53);
                      auVar178 = vsubps_avx(auVar206,auVar82);
                      auVar204 = vsubps_avx(auVar182,auVar138);
                      auVar94 = vsubps_avx(auVar56,auVar53);
                      auVar119 = vsubps_avx(auVar12,auVar82);
                      auVar138 = vsubps_avx(_local_38a8,auVar138);
                      in_ZMM13 = ZEXT1664(auVar138);
                      auVar53 = vsubps_avx(_local_3898,auVar53);
                      auVar238 = vsubps_avx(auVar119,auVar118);
                      _local_37b8 = vsubps_avx(auVar138,auVar164);
                      auVar82 = vsubps_avx(auVar53,auVar177);
                      fVar40 = auVar164._0_4_;
                      fVar109 = auVar138._0_4_ + fVar40;
                      fVar81 = auVar164._4_4_;
                      fVar132 = auVar138._4_4_ + fVar81;
                      fVar105 = auVar164._8_4_;
                      fVar75 = auVar138._8_4_ + fVar105;
                      fVar107 = auVar164._12_4_;
                      fVar79 = auVar138._12_4_ + fVar107;
                      fVar49 = auVar177._0_4_;
                      fVar191 = auVar53._0_4_ + fVar49;
                      fVar104 = auVar177._4_4_;
                      fVar202 = auVar53._4_4_ + fVar104;
                      fVar106 = auVar177._8_4_;
                      fVar198 = auVar53._8_4_ + fVar106;
                      fVar80 = auVar177._12_4_;
                      fVar200 = auVar53._12_4_ + fVar80;
                      fVar41 = auVar82._0_4_;
                      auVar229._0_4_ = fVar109 * fVar41;
                      fVar50 = auVar82._4_4_;
                      auVar229._4_4_ = fVar132 * fVar50;
                      fVar52 = auVar82._8_4_;
                      auVar229._8_4_ = fVar75 * fVar52;
                      fVar77 = auVar82._12_4_;
                      auVar229._12_4_ = fVar79 * fVar77;
                      fVar242 = local_37b8._0_4_;
                      auVar239._0_4_ = fVar242 * fVar191;
                      fVar244 = local_37b8._4_4_;
                      auVar239._4_4_ = fVar244 * fVar202;
                      fVar246 = local_37b8._8_4_;
                      auVar239._8_4_ = fVar246 * fVar198;
                      fVar248 = local_37b8._12_4_;
                      auVar239._12_4_ = fVar248 * fVar200;
                      auVar9 = vsubps_avx(auVar239,auVar229);
                      fVar203 = auVar118._0_4_;
                      fVar210 = fVar203 + auVar119._0_4_;
                      fVar211 = auVar118._4_4_;
                      fVar233 = fVar211 + auVar119._4_4_;
                      fVar213 = auVar118._8_4_;
                      fVar235 = fVar213 + auVar119._8_4_;
                      fVar215 = auVar118._12_4_;
                      fVar212 = fVar215 + auVar119._12_4_;
                      fVar135 = auVar238._0_4_;
                      auVar196._0_4_ = fVar135 * fVar191;
                      fVar159 = auVar238._4_4_;
                      auVar196._4_4_ = fVar159 * fVar202;
                      fVar214 = auVar238._8_4_;
                      auVar196._8_4_ = fVar214 * fVar198;
                      fVar223 = auVar238._12_4_;
                      auVar196._12_4_ = fVar223 * fVar200;
                      auVar240._0_4_ = fVar210 * fVar41;
                      auVar240._4_4_ = fVar233 * fVar50;
                      auVar240._8_4_ = fVar235 * fVar52;
                      auVar240._12_4_ = fVar212 * fVar77;
                      auVar10 = vsubps_avx(auVar240,auVar196);
                      auVar230._0_4_ = fVar210 * fVar242;
                      auVar230._4_4_ = fVar233 * fVar244;
                      auVar230._8_4_ = fVar235 * fVar246;
                      auVar230._12_4_ = fVar212 * fVar248;
                      auVar121._0_4_ = fVar135 * fVar109;
                      auVar121._4_4_ = fVar159 * fVar132;
                      auVar121._8_4_ = fVar214 * fVar75;
                      auVar121._12_4_ = fVar223 * fVar79;
                      auVar11 = vsubps_avx(auVar121,auVar230);
                      auVar82 = *(undefined1 (*) [16])(ray + 0x60);
                      fVar243 = auVar82._0_4_;
                      fVar245 = auVar82._4_4_;
                      fVar247 = auVar82._8_4_;
                      fVar249 = auVar82._12_4_;
                      local_3808 = *(float *)(ray + 0x50);
                      fStack_3804 = *(float *)(ray + 0x54);
                      fStack_3800 = *(float *)(ray + 0x58);
                      auVar16 = *(undefined1 (*) [12])(ray + 0x50);
                      fStack_37fc = *(float *)(ray + 0x5c);
                      fVar191 = *(float *)(ray + 0x40);
                      fVar202 = *(float *)(ray + 0x44);
                      fVar198 = *(float *)(ray + 0x48);
                      auVar17 = *(undefined1 (*) [12])(ray + 0x40);
                      fVar200 = *(float *)(ray + 0x4c);
                      auVar241._0_4_ =
                           fVar191 * auVar9._0_4_ +
                           fVar243 * auVar11._0_4_ + local_3808 * auVar10._0_4_;
                      auVar241._4_4_ =
                           fVar202 * auVar9._4_4_ +
                           fVar245 * auVar11._4_4_ + fStack_3804 * auVar10._4_4_;
                      auVar241._8_4_ =
                           fVar198 * auVar9._8_4_ +
                           fVar247 * auVar11._8_4_ + fStack_3800 * auVar10._8_4_;
                      auVar241._12_4_ =
                           fVar200 * auVar9._12_4_ +
                           fVar249 * auVar11._12_4_ + fStack_37fc * auVar10._12_4_;
                      auVar82 = vsubps_avx(auVar164,auVar204);
                      auVar164 = vsubps_avx(auVar177,auVar94);
                      fVar156 = fVar40 + auVar204._0_4_;
                      fVar162 = fVar81 + auVar204._4_4_;
                      fVar216 = fVar105 + auVar204._8_4_;
                      fVar224 = fVar107 + auVar204._12_4_;
                      fVar210 = fVar49 + auVar94._0_4_;
                      fVar233 = fVar104 + auVar94._4_4_;
                      fVar235 = fVar106 + auVar94._8_4_;
                      fVar212 = fVar80 + auVar94._12_4_;
                      fVar109 = auVar164._0_4_;
                      auVar255._0_4_ = fVar156 * fVar109;
                      fVar132 = auVar164._4_4_;
                      auVar255._4_4_ = fVar162 * fVar132;
                      fVar75 = auVar164._8_4_;
                      auVar255._8_4_ = fVar216 * fVar75;
                      fVar79 = auVar164._12_4_;
                      auVar255._12_4_ = fVar224 * fVar79;
                      fVar74 = auVar82._0_4_;
                      auVar146._0_4_ = fVar74 * fVar210;
                      fVar78 = auVar82._4_4_;
                      auVar146._4_4_ = fVar78 * fVar233;
                      fVar157 = auVar82._8_4_;
                      auVar146._8_4_ = fVar157 * fVar235;
                      fVar163 = auVar82._12_4_;
                      auVar146._12_4_ = fVar163 * fVar212;
                      auVar82 = vsubps_avx(auVar146,auVar255);
                      in_ZMM15 = ZEXT1664(auVar178);
                      auVar118 = vsubps_avx(auVar118,auVar178);
                      fVar131 = auVar118._0_4_;
                      auVar89._0_4_ = fVar131 * fVar210;
                      fVar134 = auVar118._4_4_;
                      auVar89._4_4_ = fVar134 * fVar233;
                      fVar197 = auVar118._8_4_;
                      auVar89._8_4_ = fVar197 * fVar235;
                      fVar201 = auVar118._12_4_;
                      auVar89._12_4_ = fVar201 * fVar212;
                      fVar210 = fVar203 + auVar178._0_4_;
                      fVar233 = fVar211 + auVar178._4_4_;
                      fVar235 = fVar213 + auVar178._8_4_;
                      fVar212 = fVar215 + auVar178._12_4_;
                      auVar231._0_4_ = fVar210 * fVar109;
                      auVar231._4_4_ = fVar233 * fVar132;
                      auVar231._8_4_ = fVar235 * fVar75;
                      auVar231._12_4_ = fVar212 * fVar79;
                      auVar118 = vsubps_avx(auVar231,auVar89);
                      auVar220._0_4_ = fVar210 * fVar74;
                      auVar220._4_4_ = fVar233 * fVar78;
                      auVar220._8_4_ = fVar235 * fVar157;
                      auVar220._12_4_ = fVar212 * fVar163;
                      auVar122._0_4_ = fVar131 * fVar156;
                      auVar122._4_4_ = fVar134 * fVar162;
                      auVar122._8_4_ = fVar197 * fVar216;
                      auVar122._12_4_ = fVar201 * fVar224;
                      auVar177 = vsubps_avx(auVar122,auVar220);
                      fVar133 = auVar16._0_4_;
                      fVar192 = auVar16._4_4_;
                      fVar199 = auVar16._8_4_;
                      auVar221._0_4_ =
                           fVar191 * auVar82._0_4_ +
                           fVar243 * auVar177._0_4_ + fVar133 * auVar118._0_4_;
                      auVar221._4_4_ =
                           fVar202 * auVar82._4_4_ +
                           fVar245 * auVar177._4_4_ + fVar192 * auVar118._4_4_;
                      auVar221._8_4_ =
                           fVar198 * auVar82._8_4_ +
                           fVar247 * auVar177._8_4_ + fVar199 * auVar118._8_4_;
                      auVar221._12_4_ =
                           fVar200 * auVar82._12_4_ +
                           fVar249 * auVar177._12_4_ + fStack_37fc * auVar118._12_4_;
                      auVar82 = vsubps_avx(auVar178,auVar119);
                      fVar210 = auVar178._0_4_ + auVar119._0_4_;
                      fVar233 = auVar178._4_4_ + auVar119._4_4_;
                      fVar235 = auVar178._8_4_ + auVar119._8_4_;
                      fVar212 = auVar178._12_4_ + auVar119._12_4_;
                      auVar118 = vsubps_avx(auVar204,auVar138);
                      fVar156 = auVar204._0_4_ + auVar138._0_4_;
                      fVar162 = auVar204._4_4_ + auVar138._4_4_;
                      fVar216 = auVar204._8_4_ + auVar138._8_4_;
                      fVar224 = auVar204._12_4_ + auVar138._12_4_;
                      auVar138 = vsubps_avx(auVar94,auVar53);
                      fVar137 = auVar94._0_4_ + auVar53._0_4_;
                      fVar158 = auVar94._4_4_ + auVar53._4_4_;
                      fVar161 = auVar94._8_4_ + auVar53._8_4_;
                      fVar51 = auVar94._12_4_ + auVar53._12_4_;
                      fVar226 = auVar138._0_4_;
                      auVar46._0_4_ = fVar226 * fVar156;
                      fVar234 = auVar138._4_4_;
                      auVar46._4_4_ = fVar234 * fVar162;
                      fVar236 = auVar138._8_4_;
                      auVar46._8_4_ = fVar236 * fVar216;
                      fVar237 = auVar138._12_4_;
                      auVar46._12_4_ = fVar237 * fVar224;
                      fVar76 = auVar118._0_4_;
                      auVar186._0_4_ = fVar76 * fVar137;
                      fVar136 = auVar118._4_4_;
                      auVar186._4_4_ = fVar136 * fVar158;
                      fVar160 = auVar118._8_4_;
                      auVar186._8_4_ = fVar160 * fVar161;
                      fVar108 = auVar118._12_4_;
                      auVar186._12_4_ = fVar108 * fVar51;
                      auVar138 = vsubps_avx(auVar186,auVar46);
                      fVar225 = auVar82._0_4_;
                      auVar147._0_4_ = fVar225 * fVar137;
                      fVar137 = auVar82._4_4_;
                      auVar147._4_4_ = fVar137 * fVar158;
                      fVar158 = auVar82._8_4_;
                      auVar147._8_4_ = fVar158 * fVar161;
                      fVar161 = auVar82._12_4_;
                      auVar147._12_4_ = fVar161 * fVar51;
                      auVar187._0_4_ = fVar226 * fVar210;
                      auVar187._4_4_ = fVar234 * fVar233;
                      auVar187._8_4_ = fVar236 * fVar235;
                      auVar187._12_4_ = fVar237 * fVar212;
                      auVar82 = vsubps_avx(auVar187,auVar147);
                      auVar188._8_4_ = 0x7fffffff;
                      auVar188._0_8_ = 0x7fffffff7fffffff;
                      auVar188._12_4_ = 0x7fffffff;
                      auVar64._0_4_ = fVar210 * fVar76;
                      auVar64._4_4_ = fVar233 * fVar136;
                      auVar64._8_4_ = fVar235 * fVar160;
                      auVar64._12_4_ = fVar212 * fVar108;
                      auVar90._0_4_ = fVar225 * fVar156;
                      auVar90._4_4_ = fVar137 * fVar162;
                      auVar90._8_4_ = fVar158 * fVar216;
                      auVar90._12_4_ = fVar161 * fVar224;
                      auVar53 = vsubps_avx(auVar90,auVar64);
                      auVar65._0_4_ =
                           fVar191 * auVar138._0_4_ +
                           fVar243 * auVar53._0_4_ + fVar133 * auVar82._0_4_;
                      auVar65._4_4_ =
                           fVar202 * auVar138._4_4_ +
                           fVar245 * auVar53._4_4_ + fVar192 * auVar82._4_4_;
                      auVar65._8_4_ =
                           fVar198 * auVar138._8_4_ +
                           fVar247 * auVar53._8_4_ + fVar199 * auVar82._8_4_;
                      auVar65._12_4_ =
                           fVar200 * auVar138._12_4_ +
                           fVar249 * auVar53._12_4_ + fStack_37fc * auVar82._12_4_;
                      auVar148._0_4_ = auVar65._0_4_ + auVar241._0_4_ + auVar221._0_4_;
                      auVar148._4_4_ = auVar65._4_4_ + auVar241._4_4_ + auVar221._4_4_;
                      auVar148._8_4_ = auVar65._8_4_ + auVar241._8_4_ + auVar221._8_4_;
                      auVar148._12_4_ = auVar65._12_4_ + auVar241._12_4_ + auVar221._12_4_;
                      auVar82 = vminps_avx(auVar241,auVar221);
                      auVar138 = vminps_avx(auVar82,auVar65);
                      auVar82 = vandps_avx(auVar148,auVar188);
                      auVar149._0_4_ = auVar82._0_4_ * 1.1920929e-07;
                      auVar149._4_4_ = auVar82._4_4_ * 1.1920929e-07;
                      auVar149._8_4_ = auVar82._8_4_ * 1.1920929e-07;
                      auVar149._12_4_ = auVar82._12_4_ * 1.1920929e-07;
                      uVar31 = CONCAT44(auVar149._4_4_,auVar149._0_4_);
                      auVar174._0_8_ = uVar31 ^ 0x8000000080000000;
                      auVar174._8_4_ = -auVar149._8_4_;
                      auVar174._12_4_ = -auVar149._12_4_;
                      auVar138 = vcmpps_avx(auVar138,auVar174,5);
                      auVar103 = ZEXT1664(auVar138);
                      auVar53 = vmaxps_avx(auVar241,auVar221);
                      auVar53 = vmaxps_avx(auVar53,auVar65);
                      auVar53 = vcmpps_avx(auVar53,auVar149,2);
                      auVar138 = vorps_avx(auVar138,auVar53);
                      auVar53 = auVar102 & auVar138;
                      if ((((auVar53 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                           (auVar53 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          (auVar53 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                          -1 < auVar53[0xf]) {
                        auVar232 = ZEXT1664(auVar102);
                      }
                      else {
                        auVar66._0_4_ = fVar41 * fVar74;
                        auVar66._4_4_ = fVar50 * fVar78;
                        auVar66._8_4_ = fVar52 * fVar157;
                        auVar66._12_4_ = fVar77 * fVar163;
                        in_ZMM15 = ZEXT1664(auVar164);
                        auVar91._0_4_ = fVar242 * fVar109;
                        auVar91._4_4_ = fVar244 * fVar132;
                        auVar91._8_4_ = fVar246 * fVar75;
                        auVar91._12_4_ = fVar248 * fVar79;
                        auVar177 = vsubps_avx(auVar91,auVar66);
                        auVar150._0_4_ = fVar109 * fVar76;
                        auVar150._4_4_ = fVar132 * fVar136;
                        auVar150._8_4_ = fVar75 * fVar160;
                        auVar150._12_4_ = fVar79 * fVar108;
                        auVar175._0_4_ = fVar226 * fVar74;
                        auVar175._4_4_ = fVar234 * fVar78;
                        auVar175._8_4_ = fVar236 * fVar157;
                        auVar175._12_4_ = fVar237 * fVar163;
                        auVar178 = vsubps_avx(auVar175,auVar150);
                        auVar53 = vandps_avx(auVar66,auVar188);
                        auVar118 = vandps_avx(auVar150,auVar188);
                        auVar53 = vcmpps_avx(auVar53,auVar118,1);
                        auVar177 = vblendvps_avx(auVar178,auVar177,auVar53);
                        auVar67._0_4_ = fVar131 * fVar226;
                        auVar67._4_4_ = fVar134 * fVar234;
                        auVar67._8_4_ = fVar197 * fVar236;
                        auVar67._12_4_ = fVar201 * fVar237;
                        auVar92._0_4_ = fVar131 * fVar41;
                        auVar92._4_4_ = fVar134 * fVar50;
                        auVar92._8_4_ = fVar197 * fVar52;
                        auVar92._12_4_ = fVar201 * fVar77;
                        in_ZMM13 = ZEXT1664(auVar238);
                        auVar151._0_4_ = fVar135 * fVar109;
                        auVar151._4_4_ = fVar159 * fVar132;
                        auVar151._8_4_ = fVar214 * fVar75;
                        auVar151._12_4_ = fVar223 * fVar79;
                        auVar178 = vsubps_avx(auVar92,auVar151);
                        auVar176._0_4_ = fVar109 * fVar225;
                        auVar176._4_4_ = fVar132 * fVar137;
                        auVar176._8_4_ = fVar75 * fVar158;
                        auVar176._12_4_ = fVar79 * fVar161;
                        auVar204 = vsubps_avx(auVar176,auVar67);
                        auVar53 = vandps_avx(auVar151,auVar188);
                        auVar118 = vandps_avx(auVar67,auVar188);
                        auVar53 = vcmpps_avx(auVar53,auVar118,1);
                        auVar178 = vblendvps_avx(auVar204,auVar178,auVar53);
                        auVar68._0_4_ = fVar225 * fVar74;
                        auVar68._4_4_ = fVar137 * fVar78;
                        auVar68._8_4_ = fVar158 * fVar157;
                        auVar68._12_4_ = fVar161 * fVar163;
                        auVar93._0_4_ = fVar135 * fVar74;
                        auVar93._4_4_ = fVar159 * fVar78;
                        auVar93._8_4_ = fVar214 * fVar157;
                        auVar93._12_4_ = fVar223 * fVar163;
                        auVar123._0_4_ = fVar131 * fVar242;
                        auVar123._4_4_ = fVar134 * fVar244;
                        auVar123._8_4_ = fVar197 * fVar246;
                        auVar123._12_4_ = fVar201 * fVar248;
                        auVar47._0_4_ = fVar131 * fVar76;
                        auVar47._4_4_ = fVar134 * fVar136;
                        auVar47._8_4_ = fVar197 * fVar160;
                        auVar47._12_4_ = fVar201 * fVar108;
                        auVar204 = vsubps_avx(auVar93,auVar123);
                        auVar94 = vsubps_avx(auVar47,auVar68);
                        auVar53 = vandps_avx(auVar123,auVar188);
                        auVar118 = vandps_avx(auVar68,auVar188);
                        auVar53 = vcmpps_avx(auVar53,auVar118,1);
                        auVar204 = vblendvps_avx(auVar94,auVar204,auVar53);
                        local_3898._0_4_ = auVar17._0_4_;
                        local_3898._4_4_ = auVar17._4_4_;
                        fStack_3890 = auVar17._8_4_;
                        fVar41 = auVar177._0_4_ * (float)local_3898._0_4_ +
                                 auVar204._0_4_ * fVar243 + fVar133 * auVar178._0_4_;
                        fVar109 = auVar177._4_4_ * (float)local_3898._4_4_ +
                                  auVar204._4_4_ * fVar245 + fVar192 * auVar178._4_4_;
                        fVar50 = auVar177._8_4_ * fStack_3890 +
                                 auVar204._8_4_ * fVar247 + fVar199 * auVar178._8_4_;
                        fVar132 = auVar177._12_4_ * fVar200 +
                                  auVar204._12_4_ * fVar249 + fStack_37fc * auVar178._12_4_;
                        auVar69._0_4_ = fVar41 + fVar41;
                        auVar69._4_4_ = fVar109 + fVar109;
                        auVar69._8_4_ = fVar50 + fVar50;
                        auVar69._12_4_ = fVar132 + fVar132;
                        fVar41 = auVar177._0_4_ * fVar203 +
                                 auVar204._0_4_ * fVar49 + auVar178._0_4_ * fVar40;
                        fVar109 = auVar177._4_4_ * fVar211 +
                                  auVar204._4_4_ * fVar104 + auVar178._4_4_ * fVar81;
                        fVar105 = auVar177._8_4_ * fVar213 +
                                  auVar204._8_4_ * fVar106 + auVar178._8_4_ * fVar105;
                        fVar106 = auVar177._12_4_ * fVar215 +
                                  auVar204._12_4_ * fVar80 + auVar178._12_4_ * fVar107;
                        auVar53 = vrcpps_avx(auVar69);
                        fVar40 = auVar53._0_4_;
                        auVar124._0_4_ = auVar69._0_4_ * fVar40;
                        fVar49 = auVar53._4_4_;
                        auVar124._4_4_ = auVar69._4_4_ * fVar49;
                        fVar81 = auVar53._8_4_;
                        auVar124._8_4_ = auVar69._8_4_ * fVar81;
                        fVar104 = auVar53._12_4_;
                        auVar124._12_4_ = auVar69._12_4_ * fVar104;
                        auVar152._8_4_ = 0x3f800000;
                        auVar152._0_8_ = 0x3f8000003f800000;
                        auVar152._12_4_ = 0x3f800000;
                        auVar53 = vsubps_avx(auVar152,auVar124);
                        auVar48._0_4_ = (fVar41 + fVar41) * (fVar40 + fVar40 * auVar53._0_4_);
                        auVar48._4_4_ = (fVar109 + fVar109) * (fVar49 + fVar49 * auVar53._4_4_);
                        auVar48._8_4_ = (fVar105 + fVar105) * (fVar81 + fVar81 * auVar53._8_4_);
                        auVar48._12_4_ = (fVar106 + fVar106) * (fVar104 + fVar104 * auVar53._12_4_);
                        auVar53 = *(undefined1 (*) [16])(ray + 0x80);
                        auVar118 = vcmpps_avx(*(undefined1 (*) [16])(ray + 0x30),auVar48,2);
                        auVar94 = vcmpps_avx(auVar48,auVar53,2);
                        auVar118 = vandps_avx(auVar118,auVar94);
                        auVar94 = vcmpps_avx(auVar69,ZEXT816(0) << 0x20,4);
                        auVar118 = vandps_avx(auVar94,auVar118);
                        auVar232 = ZEXT1664(auVar102);
                        auVar138 = vandps_avx(auVar102,auVar138);
                        auVar118 = vpslld_avx(auVar118,0x1f);
                        auVar94 = vpsrad_avx(auVar118,0x1f);
                        auVar103 = ZEXT1664(auVar94);
                        auVar118 = auVar138 & auVar94;
                        if ((((auVar118 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                             (auVar118 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            (auVar118 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            auVar118[0xf] < '\0') {
                          auVar138 = vandps_avx(auVar94,auVar138);
                          uVar3 = *(uint *)(lVar30 + 0x40 + uVar38 * 4);
                          pGVar4 = (context->scene->geometries).items[uVar3].ptr;
                          uVar23 = pGVar4->mask;
                          auVar95._4_4_ = uVar23;
                          auVar95._0_4_ = uVar23;
                          auVar95._8_4_ = uVar23;
                          auVar95._12_4_ = uVar23;
                          auVar118 = vandps_avx(auVar95,*(undefined1 (*) [16])(ray + 0x90));
                          auVar118 = vpcmpeqd_avx(auVar118,ZEXT816(0) << 0x20);
                          auVar103 = ZEXT1664(auVar118);
                          auVar94 = auVar138 & ~auVar118;
                          if ((((auVar94 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0
                               || (auVar94 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0
                               ) || (auVar94 >> 0x5f & (undefined1  [16])0x1) !=
                                    (undefined1  [16])0x0) || auVar94[0xf] < '\0') {
                            aVar71 = (anon_union_16_2_9473010e_for_vint_impl<4>_1)
                                     vandnps_avx(auVar118,auVar138);
                            if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                               (pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                              auVar138 = vrcpps_avx(auVar148);
                              fVar40 = auVar138._0_4_;
                              auVar127._0_4_ = auVar148._0_4_ * fVar40;
                              fVar49 = auVar138._4_4_;
                              auVar127._4_4_ = auVar148._4_4_ * fVar49;
                              fVar81 = auVar138._8_4_;
                              auVar127._8_4_ = auVar148._8_4_ * fVar81;
                              fVar104 = auVar138._12_4_;
                              auVar127._12_4_ = auVar148._12_4_ * fVar104;
                              auVar190._8_4_ = 0x3f800000;
                              auVar190._0_8_ = 0x3f8000003f800000;
                              auVar190._12_4_ = 0x3f800000;
                              auVar138 = vsubps_avx(auVar190,auVar127);
                              auVar96._0_4_ = fVar40 + fVar40 * auVar138._0_4_;
                              auVar96._4_4_ = fVar49 + fVar49 * auVar138._4_4_;
                              auVar96._8_4_ = fVar81 + fVar81 * auVar138._8_4_;
                              auVar96._12_4_ = fVar104 + fVar104 * auVar138._12_4_;
                              auVar128._8_4_ = 0x219392ef;
                              auVar128._0_8_ = 0x219392ef219392ef;
                              auVar128._12_4_ = 0x219392ef;
                              auVar82 = vcmpps_avx(auVar82,auVar128,5);
                              auVar82 = vandps_avx(auVar82,auVar96);
                              auVar129._0_4_ = auVar82._0_4_ * auVar241._0_4_;
                              auVar129._4_4_ = auVar82._4_4_ * auVar241._4_4_;
                              auVar129._8_4_ = auVar82._8_4_ * auVar241._8_4_;
                              auVar129._12_4_ = auVar82._12_4_ * auVar241._12_4_;
                              auVar138 = vminps_avx(auVar129,auVar190);
                              auVar97._0_4_ = auVar82._0_4_ * auVar221._0_4_;
                              auVar97._4_4_ = auVar82._4_4_ * auVar221._4_4_;
                              auVar97._8_4_ = auVar82._8_4_ * auVar221._8_4_;
                              auVar97._12_4_ = auVar82._12_4_ * auVar221._12_4_;
                              auVar82 = vminps_avx(auVar97,auVar190);
                              auVar118 = vsubps_avx(auVar190,auVar138);
                              auVar94 = vsubps_avx(auVar190,auVar82);
                              auVar14._8_8_ = uVar22;
                              auVar14._0_8_ = uVar21;
                              vblendvps_avx(auVar138,auVar118,auVar14);
                              auVar82 = vblendvps_avx(auVar82,auVar94,auVar14);
                              vpshufd_avx(ZEXT416(uVar3),0);
                              vpshufd_avx(ZEXT416(*(uint *)(lVar30 + 0x50 + uVar38 * 4)),0);
                              p0.field_0._0_16_ = auVar177;
                              p0.field_0._16_16_ = auVar178;
                              p0.field_0._32_16_ = auVar204;
                              vcmpps_avx(ZEXT1632(auVar82),ZEXT1632(auVar82),0xf);
                              uVar23 = context->user->instPrimID[0];
                              auVar98._4_4_ = uVar23;
                              auVar98._0_4_ = uVar23;
                              auVar98._8_4_ = uVar23;
                              auVar98._12_4_ = uVar23;
                              auVar103 = ZEXT1664(auVar98);
                              auVar82 = vblendvps_avx(auVar53,auVar48,(undefined1  [16])aVar71);
                              *(undefined1 (*) [16])(ray + 0x80) = auVar82;
                              itime.field_0 = aVar71;
                              p1.field_0._0_8_ = &itime;
                              p1.field_0._8_8_ = pGVar4->userPtr;
                              p1.field_0._16_8_ = context->user;
                              p1.field_0._24_8_ = ray;
                              p1.field_0._32_8_ = &p0;
                              p1.field_0._40_4_ = 4;
                              if (pGVar4->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                                auVar103 = ZEXT1664(auVar98);
                                in_ZMM13 = ZEXT1664(auVar238);
                                in_ZMM15 = ZEXT1664(auVar164);
                                (*pGVar4->occlusionFilterN)((RTCFilterFunctionNArguments *)&p1);
                              }
                              if (itime.field_0 == (anon_union_16_2_9473010e_for_vint_impl<4>_1)0x0)
                              {
                                auVar82 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f7aa10);
                                auVar82 = auVar82 ^ _DAT_01f7ae20;
                              }
                              else {
                                p_Var6 = context->args->filter;
                                auVar82 = ZEXT816(0) << 0x40;
                                if ((p_Var6 != (RTCFilterFunctionN)0x0) &&
                                   (((context->args->flags &
                                     RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                                     RTC_RAY_QUERY_FLAG_INCOHERENT ||
                                    (((pGVar4->field_8).field_0x2 & 0x40) != 0)))) {
                                  in_ZMM13 = ZEXT1664(in_ZMM13._0_16_);
                                  in_ZMM15 = ZEXT1664(in_ZMM15._0_16_);
                                  (*p_Var6)((RTCFilterFunctionNArguments *)&p1);
                                  auVar82 = ZEXT816(0) << 0x40;
                                }
                                auVar138 = vpcmpeqd_avx((undefined1  [16])itime.field_0,auVar82);
                                auVar82 = vpcmpeqd_avx(auVar82,auVar82);
                                auVar82 = auVar138 ^ auVar82;
                                auVar99._8_4_ = 0xff800000;
                                auVar99._0_8_ = 0xff800000ff800000;
                                auVar99._12_4_ = 0xff800000;
                                auVar103 = ZEXT1664(auVar99);
                                auVar138 = vblendvps_avx(auVar99,*(undefined1 (*) [16])
                                                                  (p1.field_0._24_8_ + 0x80),
                                                         auVar138);
                                *(undefined1 (*) [16])(p1.field_0._24_8_ + 0x80) = auVar138;
                              }
                              auVar82 = vpslld_avx(auVar82,0x1f);
                              aVar71 = (anon_union_16_2_9473010e_for_vint_impl<4>_1)
                                       vpsrad_avx(auVar82,0x1f);
                              auVar82 = vblendvps_avx(auVar53,*(undefined1 (*) [16])pRVar1,auVar82);
                              *(undefined1 (*) [16])pRVar1 = auVar82;
                            }
                            auVar102 = vpandn_avx((undefined1  [16])aVar71,auVar102);
                            auVar232 = ZEXT1664(auVar102);
                          }
                        }
                      }
                      auVar102 = auVar232._0_16_;
                      if (((((auVar102 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                            (auVar102 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                           (auVar102 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                           -1 < auVar232[0xf]) || (bVar39 = 2 < uVar38, uVar38 = uVar38 + 1, bVar39)
                         ) break;
                    }
                    auVar82 = vandps_avx(auVar102,auVar217);
                    auVar217 = auVar217 & auVar102;
                  } while (((((auVar217 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                             (auVar217 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            (auVar217 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                            auVar217[0xf] < '\0') &&
                          (uVar27 = uVar27 + 1, auVar217 = auVar82, uVar27 < uVar26 - 8));
                  auVar102 = vpcmpeqd_avx(auVar103._0_16_,auVar103._0_16_);
                  aVar72._0_4_ = auVar82._0_4_ ^ auVar102._0_4_;
                  aVar72._4_4_ = auVar82._4_4_ ^ auVar102._4_4_;
                  aVar72._8_4_ = auVar82._8_4_ ^ auVar102._8_4_;
                  aVar72._12_4_ = auVar82._12_4_ ^ auVar102._12_4_;
                }
                terminated.field_0 =
                     (anon_union_16_2_9473010e_for_vboolf_impl<4>_1)
                     vorps_avx((undefined1  [16])terminated.field_0,(undefined1  [16])aVar72);
                auVar102 = auVar102 & ~(undefined1  [16])terminated.field_0;
                if ((((auVar102 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                     (auVar102 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    (auVar102 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                    -1 < auVar102[0xf]) goto LAB_003da611;
                auVar101._8_4_ = 0xff800000;
                auVar101._0_8_ = 0xff800000ff800000;
                auVar101._12_4_ = 0xff800000;
                tray.tfar.field_0 =
                     (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                     vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar101,
                                   (undefined1  [16])terminated.field_0);
              }
              goto LAB_003d8ca2;
            }
            uVar26 = root.ptr & 0xfffffffffffffff0;
            auVar102 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,auVar102,6);
            aVar54.i[2] = 0x7f800000;
            aVar54._0_8_ = 0x7f8000007f800000;
            aVar54.i[3] = 0x7f800000;
            lVar30 = -0x20;
            sVar33 = 8;
            do {
              root.ptr = *(size_t *)(uVar26 + 0x40 + lVar30 * 2);
              if (root.ptr == 8) {
                auVar103 = ZEXT1664((undefined1  [16])aVar54);
                root.ptr = sVar33;
                break;
              }
              fVar40 = *(float *)(uVar26 + 0x120 + lVar30);
              fVar49 = *(float *)(uVar26 + 0x60 + lVar30);
              auVar82 = *(undefined1 (*) [16])(ray + 0x70);
              fVar81 = auVar82._0_4_;
              fVar104 = auVar82._4_4_;
              fVar105 = auVar82._8_4_;
              fVar106 = auVar82._12_4_;
              auVar110._0_4_ = fVar81 * fVar40 + fVar49;
              auVar110._4_4_ = fVar104 * fVar40 + fVar49;
              auVar110._8_4_ = fVar105 * fVar40 + fVar49;
              auVar110._12_4_ = fVar106 * fVar40 + fVar49;
              fVar40 = *(float *)(uVar26 + 0x160 + lVar30);
              fVar49 = *(float *)(uVar26 + 0xa0 + lVar30);
              auVar139._0_4_ = fVar81 * fVar40 + fVar49;
              auVar139._4_4_ = fVar104 * fVar40 + fVar49;
              auVar139._8_4_ = fVar105 * fVar40 + fVar49;
              auVar139._12_4_ = fVar106 * fVar40 + fVar49;
              fVar40 = *(float *)(uVar26 + 0x1a0 + lVar30);
              fVar49 = *(float *)(uVar26 + 0xe0 + lVar30);
              auVar165._0_4_ = fVar81 * fVar40 + fVar49;
              auVar165._4_4_ = fVar104 * fVar40 + fVar49;
              auVar165._8_4_ = fVar105 * fVar40 + fVar49;
              auVar165._12_4_ = fVar106 * fVar40 + fVar49;
              fVar40 = *(float *)(uVar26 + 0x140 + lVar30);
              fVar49 = *(float *)(uVar26 + 0x80 + lVar30);
              auVar179._0_4_ = fVar81 * fVar40 + fVar49;
              auVar179._4_4_ = fVar104 * fVar40 + fVar49;
              auVar179._8_4_ = fVar105 * fVar40 + fVar49;
              auVar179._12_4_ = fVar106 * fVar40 + fVar49;
              fVar40 = *(float *)(uVar26 + 0x180 + lVar30);
              fVar49 = *(float *)(uVar26 + 0xc0 + lVar30);
              auVar193._0_4_ = fVar49 + fVar81 * fVar40;
              auVar193._4_4_ = fVar49 + fVar104 * fVar40;
              auVar193._8_4_ = fVar49 + fVar105 * fVar40;
              auVar193._12_4_ = fVar49 + fVar106 * fVar40;
              fVar40 = *(float *)(uVar26 + 0x1c0 + lVar30);
              fVar49 = *(float *)(uVar26 + 0x100 + lVar30);
              auVar205._0_4_ = fVar40 * fVar81 + fVar49;
              auVar205._4_4_ = fVar40 * fVar104 + fVar49;
              auVar205._8_4_ = fVar40 * fVar105 + fVar49;
              auVar205._12_4_ = fVar40 * fVar106 + fVar49;
              auVar9._8_8_ = tray.org.field_0._8_8_;
              auVar9._0_8_ = tray.org.field_0._0_8_;
              auVar10._8_8_ = tray.org.field_0._24_8_;
              auVar10._0_8_ = tray.org.field_0._16_8_;
              auVar11._8_8_ = tray.org.field_0._40_8_;
              auVar11._0_8_ = tray.org.field_0._32_8_;
              auVar138 = vsubps_avx(auVar110,auVar9);
              auVar250._0_4_ = tray.rdir.field_0._0_4_ * auVar138._0_4_;
              auVar250._4_4_ = tray.rdir.field_0._4_4_ * auVar138._4_4_;
              auVar250._8_4_ = tray.rdir.field_0._8_4_ * auVar138._8_4_;
              auVar250._12_4_ = tray.rdir.field_0._12_4_ * auVar138._12_4_;
              in_ZMM13 = ZEXT1664(auVar250);
              auVar138 = vsubps_avx(auVar139,auVar10);
              auVar252._0_4_ = auVar138._0_4_ * (float)tray.rdir.field_0._16_4_;
              auVar252._4_4_ = auVar138._4_4_ * (float)tray.rdir.field_0._20_4_;
              auVar252._8_4_ = auVar138._8_4_ * (float)tray.rdir.field_0._24_4_;
              auVar252._12_4_ = auVar138._12_4_ * (float)tray.rdir.field_0._28_4_;
              auVar138 = vsubps_avx(auVar165,auVar11);
              auVar254._0_4_ = auVar138._0_4_ * (float)tray.rdir.field_0._32_4_;
              auVar254._4_4_ = auVar138._4_4_ * (float)tray.rdir.field_0._36_4_;
              auVar254._8_4_ = auVar138._8_4_ * (float)tray.rdir.field_0._40_4_;
              auVar254._12_4_ = auVar138._12_4_ * (float)tray.rdir.field_0._44_4_;
              in_ZMM15 = ZEXT1664(auVar254);
              auVar138 = vsubps_avx(auVar179,auVar9);
              auVar180._0_4_ = tray.rdir.field_0._0_4_ * auVar138._0_4_;
              auVar180._4_4_ = tray.rdir.field_0._4_4_ * auVar138._4_4_;
              auVar180._8_4_ = tray.rdir.field_0._8_4_ * auVar138._8_4_;
              auVar180._12_4_ = tray.rdir.field_0._12_4_ * auVar138._12_4_;
              auVar138 = vsubps_avx(auVar193,auVar10);
              auVar140._0_4_ = auVar138._0_4_ * (float)tray.rdir.field_0._16_4_;
              auVar140._4_4_ = auVar138._4_4_ * (float)tray.rdir.field_0._20_4_;
              auVar140._8_4_ = auVar138._8_4_ * (float)tray.rdir.field_0._24_4_;
              auVar140._12_4_ = auVar138._12_4_ * (float)tray.rdir.field_0._28_4_;
              auVar138 = vsubps_avx(auVar205,auVar11);
              auVar166._0_4_ = auVar138._0_4_ * (float)tray.rdir.field_0._32_4_;
              auVar166._4_4_ = auVar138._4_4_ * (float)tray.rdir.field_0._36_4_;
              auVar166._8_4_ = auVar138._8_4_ * (float)tray.rdir.field_0._40_4_;
              auVar166._12_4_ = auVar138._12_4_ * (float)tray.rdir.field_0._44_4_;
              auVar138 = vpminsd_avx(auVar250,auVar180);
              auVar53 = vpminsd_avx(auVar252,auVar140);
              auVar138 = vpmaxsd_avx(auVar138,auVar53);
              auVar53 = vpminsd_avx(auVar254,auVar166);
              auVar138 = vpmaxsd_avx(auVar138,auVar53);
              auVar111._0_4_ = auVar138._0_4_ * 0.99999964;
              auVar111._4_4_ = auVar138._4_4_ * 0.99999964;
              auVar111._8_4_ = auVar138._8_4_ * 0.99999964;
              auVar111._12_4_ = auVar138._12_4_ * 0.99999964;
              auVar138 = vpmaxsd_avx(auVar250,auVar180);
              auVar53 = vpmaxsd_avx(auVar252,auVar140);
              auVar53 = vpminsd_avx(auVar138,auVar53);
              auVar138 = vpmaxsd_avx(auVar254,auVar166);
              auVar53 = vpminsd_avx(auVar53,auVar138);
              auVar138 = vpmaxsd_avx(auVar111,(undefined1  [16])tray.tnear.field_0);
              auVar167._0_4_ = auVar53._0_4_ * 1.0000004;
              auVar167._4_4_ = auVar53._4_4_ * 1.0000004;
              auVar167._8_4_ = auVar53._8_4_ * 1.0000004;
              auVar167._12_4_ = auVar53._12_4_ * 1.0000004;
              auVar53 = vpminsd_avx(auVar167,(undefined1  [16])tray.tfar.field_0);
              if ((uVar23 & 7) == 6) {
                auVar138 = vcmpps_avx(auVar138,auVar53,2);
                uVar24 = *(undefined4 *)(uVar26 + 0x1e0 + lVar30);
                auVar168._4_4_ = uVar24;
                auVar168._0_4_ = uVar24;
                auVar168._8_4_ = uVar24;
                auVar168._12_4_ = uVar24;
                auVar53 = vcmpps_avx(auVar168,auVar82,2);
                uVar24 = *(undefined4 *)(uVar26 + 0x200 + lVar30);
                auVar181._4_4_ = uVar24;
                auVar181._0_4_ = uVar24;
                auVar181._8_4_ = uVar24;
                auVar181._12_4_ = uVar24;
                auVar82 = vcmpps_avx(auVar82,auVar181,1);
                auVar82 = vandps_avx(auVar53,auVar82);
                auVar82 = vandps_avx(auVar82,auVar138);
              }
              else {
                auVar82 = vcmpps_avx(auVar138,auVar53,2);
              }
              auVar82 = vandps_avx(auVar82,auVar102);
              auVar82 = vpslld_avx(auVar82,0x1f);
              if ((((auVar82 >> 0x1f & (undefined1  [16])0x1) == (undefined1  [16])0x0 &&
                   (auVar82 >> 0x3f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  (auVar82 >> 0x5f & (undefined1  [16])0x1) == (undefined1  [16])0x0) &&
                  -1 < auVar82[0xf]) {
                auVar103 = ZEXT1664((undefined1  [16])aVar54);
                root.ptr = sVar33;
              }
              else {
                auVar141._8_4_ = 0x7f800000;
                auVar141._0_8_ = 0x7f8000007f800000;
                auVar141._12_4_ = 0x7f800000;
                auVar82 = vblendvps_avx(auVar141,auVar111,auVar82);
                auVar103 = ZEXT1664(auVar82);
                if (sVar33 != 8) {
                  pNVar37->ptr = sVar33;
                  pNVar37 = pNVar37 + 1;
                  *paVar36 = aVar54;
                  paVar36 = paVar36 + 1;
                }
              }
              aVar54 = auVar103._0_16_;
              lVar30 = lVar30 + 4;
              sVar33 = root.ptr;
            } while (lVar30 != 0);
            if (root.ptr == 8) goto LAB_003d8f72;
            auVar102 = vcmpps_avx((undefined1  [16])tray.tfar.field_0,
                                  (undefined1  [16])auVar103._0_16_,6);
            uVar24 = vmovmskps_avx(auVar102);
          } while ((byte)uVar32 < (byte)POPCOUNT(uVar24));
          pNVar37->ptr = root.ptr;
          pNVar37 = pNVar37 + 1;
          *paVar36 = auVar103._0_16_;
          paVar36 = paVar36 + 1;
LAB_003d8f72:
          iVar25 = 4;
        }
        else {
          do {
            sVar33 = 0;
            if (uVar26 != 0) {
              for (; (uVar26 >> sVar33 & 1) == 0; sVar33 = sVar33 + 1) {
              }
            }
            in_ZMM13 = ZEXT1664(in_ZMM13._0_16_);
            in_ZMM15 = ZEXT1664(in_ZMM15._0_16_);
            bVar39 = occluded1(This,bvh,root,sVar33,&pre,ray,&tray,context);
            if (bVar39) {
              *(undefined4 *)(local_37b8 + sVar33 * 4 + -0x10) = 0xffffffff;
            }
            uVar26 = uVar26 & uVar26 - 1;
          } while (uVar26 != 0);
          auVar102 = _DAT_01f7ae20 & ~(undefined1  [16])terminated.field_0;
          iVar25 = 3;
          if ((((auVar102 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
               (auVar102 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar102 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              auVar102[0xf] < '\0') {
            auVar102._8_4_ = 0xff800000;
            auVar102._0_8_ = 0xff800000ff800000;
            auVar102._12_4_ = 0xff800000;
            tray.tfar.field_0 =
                 (anon_union_16_3_4e90abd3_for_vfloat_impl<4>_1)
                 vblendvps_avx((undefined1  [16])tray.tfar.field_0,auVar102,
                               (undefined1  [16])terminated.field_0);
            iVar25 = 2;
          }
          if (uVar32 < uVar23) goto LAB_003d8ce7;
        }
      } while (iVar25 != 3);
LAB_003da611:
      auVar7 = vandps_avx(auVar7,(undefined1  [16])terminated.field_0);
      auVar73._8_4_ = 0xff800000;
      auVar73._0_8_ = 0xff800000ff800000;
      auVar73._12_4_ = 0xff800000;
      auVar7 = vmaskmovps_avx(auVar7,auVar73);
      *(undefined1 (*) [16])pRVar1 = auVar7;
      return;
    }
  }
  return;
}

Assistant:

void BVHNIntersectorKHybrid<N, K, types, robust, PrimitiveIntersectorK, single>::occluded(vint<K>* __restrict__ valid_i,
                                                                                              Accel::Intersectors* __restrict__ This,
                                                                                              RayK<K>& __restrict__ ray,
                                                                                              RayQueryContext* context)
    {
      BVH* __restrict__ bvh = (BVH*)This->ptr;
      
      /* we may traverse an empty BVH in case all geometry was invalid */
      if (bvh->root == BVH::emptyNode)
        return;
      
#if ENABLE_FAST_COHERENT_CODEPATHS == 1
      assert(context);
      if (unlikely(types == BVH_AN1 && context->user && context->isCoherent()))
      {
        occludedCoherent(valid_i, This, ray, context);
        return;
      }
#endif

      /* filter out already occluded and invalid rays */
      vbool<K> valid = (*valid_i == -1) & (ray.tfar >= 0.0f);
#if defined(EMBREE_IGNORE_INVALID_RAYS)
      valid &= ray.valid();
#endif

      /* return if there are no valid rays */
      const size_t valid_bits = movemask(valid);
      if (unlikely(valid_bits == 0)) return;

      /* verify correct input */
      assert(all(valid, ray.valid()));
      assert(all(valid, ray.tnear() >= 0.0f));
      assert(!(types & BVH_MB) || all(valid, (ray.time() >= 0.0f) & (ray.time() <= 1.0f)));
      Precalculations pre(valid, ray);

      /* load ray */
      TravRayK<K, robust> tray(ray.org, ray.dir, single ? N : 0);
      const vfloat<K> org_ray_tnear = max(ray.tnear(), 0.0f);
      const vfloat<K> org_ray_tfar  = max(ray.tfar , 0.0f);

      tray.tnear = select(valid, org_ray_tnear, vfloat<K>(pos_inf));
      tray.tfar  = select(valid, org_ray_tfar , vfloat<K>(neg_inf));

      vbool<K> terminated = !valid;
      const vfloat<K> inf = vfloat<K>(pos_inf);

      /* determine switch threshold based on flags */
      const size_t switchThreshold = (context->user && context->isCoherent()) ? 2 : switchThresholdIncoherent;

      /* allocate stack and push root node */
      vfloat<K> stack_near[stackSizeChunk];
      NodeRef stack_node[stackSizeChunk];
      stack_node[0] = BVH::invalidNode;
      stack_near[0] = inf;
      stack_node[1] = bvh->root;
      stack_near[1] = tray.tnear;
      NodeRef* stackEnd MAYBE_UNUSED = stack_node+stackSizeChunk;
      NodeRef* __restrict__ sptr_node = stack_node + 2;
      vfloat<K>* __restrict__ sptr_near = stack_near + 2;

      while (1) pop:
      {
        /* pop next node from stack */
        assert(sptr_node > stack_node);
        sptr_node--;
        sptr_near--;
        NodeRef cur = *sptr_node;
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }

        /* cull node if behind closest hit point */
        vfloat<K> curDist = *sptr_near;
        const vbool<K> active = curDist < tray.tfar;
        if (unlikely(none(active)))
          continue;

        /* switch to single ray traversal */
#if (!defined(__WIN32__) || defined(__X86_64__)) && ((defined(__aarch64__)) || defined(__SSE4_2__))
#if FORCE_SINGLE_MODE == 0
        if (single)
#endif
        {
          size_t bits = movemask(active);
#if FORCE_SINGLE_MODE == 0
          if (unlikely(popcnt(bits) <= switchThreshold)) 
#endif
          {
            for (; bits!=0; ) {
              const size_t i = bscf(bits);
              if (occluded1(This, bvh, cur, i, pre, ray, tray, context))
                set(terminated, i);
            }
            if (all(terminated)) break;
            tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar);
            continue;
          }
        }
#endif

        while (likely(!cur.isLeaf()))
        {
          /* process nodes */
          const vbool<K> valid_node = tray.tfar > curDist;
          STAT3(shadow.trav_nodes, 1, popcnt(valid_node), K);
          const NodeRef nodeRef = cur;
          const BaseNode* __restrict__ const node = nodeRef.baseNode();

          /* set cur to invalid */
          cur = BVH::emptyNode;
          curDist = pos_inf;

          for (unsigned i = 0; i < N; i++)
          {
            const NodeRef child = node->children[i];
            if (unlikely(child == BVH::emptyNode)) break;
            vfloat<K> lnearP;
            vbool<K> lhit = valid_node;
            BVHNNodeIntersectorK<N, K, types, robust>::intersect(nodeRef, i, tray, ray.time(), lnearP, lhit);

            /* if we hit the child we push the previously hit node onto the stack, and continue with the currently hit child */
            if (likely(any(lhit)))
            {
              assert(sptr_node < stackEnd);
              assert(child != BVH::emptyNode);
              const vfloat<K> childDist = select(lhit, lnearP, inf);

              /* push 'cur' node onto stack and continue with hit child */
              if (likely(cur != BVH::emptyNode)) {
                *sptr_node = cur; sptr_node++;
                *sptr_near = curDist; sptr_near++;
              }
              curDist = childDist;
              cur = child;
            }
          }
          if (unlikely(cur == BVH::emptyNode))
            goto pop;

#if SWITCH_DURING_DOWN_TRAVERSAL == 1
          if (single)
          {
            // seems to be the best place for testing utilization
            if (unlikely(popcnt(tray.tfar > curDist) <= switchThreshold))
            {
              *sptr_node++ = cur;
              *sptr_near++ = curDist;
              goto pop;
            }
          }
#endif
	}

        /* return if stack is empty */
        if (unlikely(cur == BVH::invalidNode)) {
          assert(sptr_node == stack_node);
          break;
        }


        /* intersect leaf */
        assert(cur != BVH::emptyNode);
        const vbool<K> valid_leaf = tray.tfar > curDist;
        STAT3(shadow.trav_leaves, 1, popcnt(valid_leaf), K);
        if (unlikely(none(valid_leaf))) continue;
        size_t items; const Primitive* prim = (Primitive*) cur.leaf(items);

        size_t lazy_node = 0;
        terminated |= PrimitiveIntersectorK::occluded(!terminated, This, pre, ray, context, prim, items, tray, lazy_node);
        if (all(terminated)) break;
        tray.tfar = select(terminated, vfloat<K>(neg_inf), tray.tfar); // ignore node intersections for terminated rays

        if (unlikely(lazy_node)) {
          *sptr_node = lazy_node; sptr_node++;
          *sptr_near = neg_inf;   sptr_near++;
        }
      }

      vfloat<K>::store(valid & terminated, &ray.tfar, neg_inf);
    }